

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  float *pfVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  long lVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [32];
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [28];
  undefined1 auVar89 [24];
  uint uVar90;
  int iVar91;
  uint uVar92;
  ulong uVar93;
  long lVar94;
  uint uVar95;
  ulong uVar96;
  long lVar97;
  undefined8 uVar98;
  float fVar120;
  vint4 bi_2;
  undefined1 auVar99 [16];
  float fVar118;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar105 [32];
  undefined1 auVar103 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar119;
  float fVar121;
  float fVar122;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined4 uVar126;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 ai_2;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  vint4 ai;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  vint4 bi;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [64];
  undefined4 uVar203;
  vint4 ai_1;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar222;
  float fVar228;
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar229 [32];
  float fVar234;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar233 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_940 [32];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_800;
  undefined8 uStack_7f8;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 (*local_728) [32];
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_6f0 [8];
  undefined8 uStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  LinearSpace3fa *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  undefined1 auStack_51c [8];
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  int local_4a0;
  int local_49c;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined1 local_440 [32];
  float local_420 [4];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar147 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  
  PVar6 = prim[1];
  uVar96 = (ulong)(byte)PVar6;
  fVar149 = *(float *)(prim + uVar96 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar96 * 0x19 + 6));
  auVar99._0_4_ = fVar149 * auVar12._0_4_;
  auVar99._4_4_ = fVar149 * auVar12._4_4_;
  auVar99._8_4_ = fVar149 * auVar12._8_4_;
  auVar99._12_4_ = fVar149 * auVar12._12_4_;
  auVar185._0_4_ = fVar149 * auVar13._0_4_;
  auVar185._4_4_ = fVar149 * auVar13._4_4_;
  auVar185._8_4_ = fVar149 * auVar13._8_4_;
  auVar185._12_4_ = fVar149 * auVar13._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar96 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar93 = (ulong)(uint)((int)(uVar96 * 9) * 2);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar96 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar93 = (ulong)(uint)((int)(uVar96 * 5) << 2);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar230._4_4_ = auVar185._0_4_;
  auVar230._0_4_ = auVar185._0_4_;
  auVar230._8_4_ = auVar185._0_4_;
  auVar230._12_4_ = auVar185._0_4_;
  auVar128 = vshufps_avx(auVar185,auVar185,0x55);
  auVar100 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar149 = auVar100._0_4_;
  auVar218._0_4_ = fVar149 * auVar14._0_4_;
  fVar118 = auVar100._4_4_;
  auVar218._4_4_ = fVar118 * auVar14._4_4_;
  fVar120 = auVar100._8_4_;
  auVar218._8_4_ = fVar120 * auVar14._8_4_;
  fVar148 = auVar100._12_4_;
  auVar218._12_4_ = fVar148 * auVar14._12_4_;
  auVar215._0_4_ = auVar17._0_4_ * fVar149;
  auVar215._4_4_ = auVar17._4_4_ * fVar118;
  auVar215._8_4_ = auVar17._8_4_ * fVar120;
  auVar215._12_4_ = auVar17._12_4_ * fVar148;
  auVar204._0_4_ = auVar150._0_4_ * fVar149;
  auVar204._4_4_ = auVar150._4_4_ * fVar118;
  auVar204._8_4_ = auVar150._8_4_ * fVar120;
  auVar204._12_4_ = auVar150._12_4_ * fVar148;
  auVar100 = vfmadd231ps_fma(auVar218,auVar128,auVar13);
  auVar129 = vfmadd231ps_fma(auVar215,auVar128,auVar16);
  auVar128 = vfmadd231ps_fma(auVar204,auVar101,auVar128);
  auVar170 = vfmadd231ps_fma(auVar100,auVar230,auVar12);
  auVar129 = vfmadd231ps_fma(auVar129,auVar230,auVar15);
  auVar181 = vfmadd231ps_fma(auVar128,auVar102,auVar230);
  auVar231._4_4_ = auVar99._0_4_;
  auVar231._0_4_ = auVar99._0_4_;
  auVar231._8_4_ = auVar99._0_4_;
  auVar231._12_4_ = auVar99._0_4_;
  auVar128 = vshufps_avx(auVar99,auVar99,0x55);
  auVar100 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar149 = auVar100._0_4_;
  auVar186._0_4_ = fVar149 * auVar14._0_4_;
  fVar118 = auVar100._4_4_;
  auVar186._4_4_ = fVar118 * auVar14._4_4_;
  fVar120 = auVar100._8_4_;
  auVar186._8_4_ = fVar120 * auVar14._8_4_;
  fVar148 = auVar100._12_4_;
  auVar186._12_4_ = fVar148 * auVar14._12_4_;
  auVar127._0_4_ = auVar17._0_4_ * fVar149;
  auVar127._4_4_ = auVar17._4_4_ * fVar118;
  auVar127._8_4_ = auVar17._8_4_ * fVar120;
  auVar127._12_4_ = auVar17._12_4_ * fVar148;
  auVar100._0_4_ = auVar150._0_4_ * fVar149;
  auVar100._4_4_ = auVar150._4_4_ * fVar118;
  auVar100._8_4_ = auVar150._8_4_ * fVar120;
  auVar100._12_4_ = auVar150._12_4_ * fVar148;
  auVar13 = vfmadd231ps_fma(auVar186,auVar128,auVar13);
  auVar14 = vfmadd231ps_fma(auVar127,auVar128,auVar16);
  auVar16 = vfmadd231ps_fma(auVar100,auVar128,auVar101);
  auVar17 = vfmadd231ps_fma(auVar13,auVar231,auVar12);
  auVar101 = vfmadd231ps_fma(auVar14,auVar231,auVar15);
  auVar150 = vfmadd231ps_fma(auVar16,auVar231,auVar102);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar170,local_290);
  auVar180._8_4_ = 0x219392ef;
  auVar180._0_8_ = 0x219392ef219392ef;
  auVar180._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar180,1);
  auVar13 = vblendvps_avx(auVar170,auVar180,auVar12);
  auVar12 = vandps_avx(auVar129,local_290);
  auVar12 = vcmpps_avx(auVar12,auVar180,1);
  auVar14 = vblendvps_avx(auVar129,auVar180,auVar12);
  auVar12 = vandps_avx(auVar181,local_290);
  auVar12 = vcmpps_avx(auVar12,auVar180,1);
  auVar12 = vblendvps_avx(auVar181,auVar180,auVar12);
  auVar15 = vrcpps_avx(auVar13);
  auVar199._8_4_ = 0x3f800000;
  auVar199._0_8_ = &DAT_3f8000003f800000;
  auVar199._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar199);
  auVar15 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar13,auVar199);
  auVar16 = vfmadd132ps_fma(auVar14,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar13,auVar199);
  auVar102 = vfmadd132ps_fma(auVar12,auVar13,auVar13);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar96 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar181._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar181._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar181._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar181._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar96 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar187._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar187._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar187._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar187._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar129._1_3_ = 0;
  auVar129[0] = PVar6;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar96 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar15);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar101);
  auVar205._0_4_ = auVar12._0_4_ * auVar16._0_4_;
  auVar205._4_4_ = auVar12._4_4_ * auVar16._4_4_;
  auVar205._8_4_ = auVar12._8_4_ * auVar16._8_4_;
  auVar205._12_4_ = auVar12._12_4_ * auVar16._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar13);
  auVar12 = vsubps_avx(auVar12,auVar101);
  auVar128._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar128._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar128._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar128._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar93 + uVar96 + 6);
  auVar12 = vpmovsxwd_avx(auVar16);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar150);
  auVar170._0_4_ = auVar102._0_4_ * auVar12._0_4_;
  auVar170._4_4_ = auVar102._4_4_ * auVar12._4_4_;
  auVar170._8_4_ = auVar102._8_4_ * auVar12._8_4_;
  auVar170._12_4_ = auVar102._12_4_ * auVar12._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar96 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar17);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar150);
  auVar101._0_4_ = auVar102._0_4_ * auVar12._0_4_;
  auVar101._4_4_ = auVar102._4_4_ * auVar12._4_4_;
  auVar101._8_4_ = auVar102._8_4_ * auVar12._8_4_;
  auVar101._12_4_ = auVar102._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar181,auVar187);
  auVar13 = vpminsd_avx(auVar205,auVar128);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vpminsd_avx(auVar170,auVar101);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar208._4_4_ = uVar126;
  auVar208._0_4_ = uVar126;
  auVar208._8_4_ = uVar126;
  auVar208._12_4_ = uVar126;
  auVar13 = vmaxps_avx(auVar13,auVar208);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  local_2a0._0_4_ = auVar12._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar12._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar12._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar181,auVar187);
  auVar13 = vpmaxsd_avx(auVar205,auVar128);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar13 = vpmaxsd_avx(auVar170,auVar101);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar150._4_4_ = uVar126;
  auVar150._0_4_ = uVar126;
  auVar150._8_4_ = uVar126;
  auVar150._12_4_ = uVar126;
  auVar13 = vminps_avx(auVar13,auVar150);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar102._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar102._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar102._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar102._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar129[4] = PVar6;
  auVar129._5_3_ = 0;
  auVar129[8] = PVar6;
  auVar129._9_3_ = 0;
  auVar129[0xc] = PVar6;
  auVar129._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar129,_DAT_01ff0cf0);
  auVar12 = vcmpps_avx(local_2a0,auVar102,2);
  auVar12 = vandps_avx(auVar12,auVar13);
  uVar90 = vmovmskps_avx(auVar12);
  if (uVar90 != 0) {
    uVar90 = uVar90 & 0xff;
    local_5c8 = pre->ray_space + k;
    local_5c0 = mm_lookupmask_ps._16_8_;
    uStack_5b8 = mm_lookupmask_ps._24_8_;
    uStack_5b0 = mm_lookupmask_ps._16_8_;
    uStack_5a8 = mm_lookupmask_ps._24_8_;
    local_728 = (undefined1 (*) [32])&local_120;
    iVar91 = 1 << ((uint)k & 0x1f);
    auVar105._4_4_ = iVar91;
    auVar105._0_4_ = iVar91;
    auVar105._8_4_ = iVar91;
    auVar105._12_4_ = iVar91;
    auVar105._16_4_ = iVar91;
    auVar105._20_4_ = iVar91;
    auVar105._24_4_ = iVar91;
    auVar105._28_4_ = iVar91;
    auVar115 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar105 = vpand_avx2(auVar105,auVar115);
    local_280 = vpcmpeqd_avx2(auVar105,auVar115);
    do {
      lVar19 = 0;
      for (uVar93 = (ulong)uVar90; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar7 = *(uint *)(prim + 2);
      uVar8 = *(uint *)(prim + lVar19 * 4 + 6);
      pGVar9 = (context->scene->geometries).items[uVar7].ptr;
      uVar93 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               (ulong)uVar8 *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar97 = (long)pGVar9[1].intersectionFilterN * uVar93;
      lVar94 = (long)pGVar9[1].intersectionFilterN * (uVar93 + 1);
      lVar19 = *(long *)&pGVar9[1].time_range.upper;
      auVar12 = *(undefined1 (*) [16])(lVar19 + lVar97);
      _local_6f0 = *(undefined1 (*) [16])(lVar19 + lVar94);
      uVar126 = *(undefined4 *)(lVar19 + 0xc + lVar97);
      auVar200._4_4_ = uVar126;
      auVar200._0_4_ = uVar126;
      auVar200._8_4_ = uVar126;
      auVar200._12_4_ = uVar126;
      local_220._16_4_ = uVar126;
      local_220._0_16_ = auVar200;
      local_220._20_4_ = uVar126;
      local_220._24_4_ = uVar126;
      local_220._28_4_ = uVar126;
      iVar91 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar149 = *(float *)(lVar19 + 0xc + lVar94);
      auVar232._4_4_ = fVar149;
      auVar232._0_4_ = fVar149;
      auVar232._8_4_ = fVar149;
      auVar232._12_4_ = fVar149;
      fStack_230 = fVar149;
      _local_240 = auVar232;
      fStack_22c = fVar149;
      fStack_228 = fVar149;
      uStack_224 = fVar149;
      lVar19 = (long)iVar91 * 0x44;
      auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar130._8_4_ = 0xbeaaaaab;
      auVar130._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar130._12_4_ = 0xbeaaaaab;
      local_740 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar9[2].intersectionFilterN +
                                    uVar93 * (long)pGVar9[2].pointQueryFunc),auVar12,auVar130);
      local_750 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar9[2].intersectionFilterN +
                                   (long)pGVar9[2].pointQueryFunc * (uVar93 + 1)),_local_6f0,
                                  auVar130);
      auVar15 = vsubps_avx(auVar12,auVar13);
      uVar126 = auVar15._0_4_;
      auVar151._4_4_ = uVar126;
      auVar151._0_4_ = uVar126;
      auVar151._8_4_ = uVar126;
      auVar151._12_4_ = uVar126;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      aVar4 = (local_5c8->vx).field_0;
      aVar5 = (local_5c8->vy).field_0;
      fVar118 = (local_5c8->vz).field_0.m128[0];
      fVar120 = *(float *)((long)&(local_5c8->vz).field_0 + 4);
      fVar148 = *(float *)((long)&(local_5c8->vz).field_0 + 8);
      fVar119 = *(float *)((long)&(local_5c8->vz).field_0 + 0xc);
      auVar206._0_4_ = fVar118 * auVar15._0_4_;
      auVar206._4_4_ = fVar120 * auVar15._4_4_;
      auVar206._8_4_ = fVar148 * auVar15._8_4_;
      auVar206._12_4_ = fVar119 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar5,auVar14);
      auVar102 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar4,auVar151);
      auVar16 = vinsertps_avx(auVar102,auVar200,0x30);
      auVar15 = vsubps_avx(local_740,auVar13);
      uVar126 = auVar15._0_4_;
      auVar171._4_4_ = uVar126;
      auVar171._0_4_ = uVar126;
      auVar171._8_4_ = uVar126;
      auVar171._12_4_ = uVar126;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar216._0_4_ = fVar118 * auVar15._0_4_;
      auVar216._4_4_ = fVar120 * auVar15._4_4_;
      auVar216._8_4_ = fVar148 * auVar15._8_4_;
      auVar216._12_4_ = fVar119 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar5,auVar14);
      auVar101 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar4,auVar171);
      auVar17 = vsubps_avx(local_750,auVar13);
      auVar14 = vshufps_avx(auVar17,auVar17,0x55);
      auVar15 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar201._0_4_ = fVar118 * auVar15._0_4_;
      auVar201._4_4_ = fVar120 * auVar15._4_4_;
      auVar201._8_4_ = fVar148 * auVar15._8_4_;
      auVar201._12_4_ = fVar119 * auVar15._12_4_;
      auVar15 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar5,auVar14);
      auVar14 = vblendps_avx(auVar101,local_740,8);
      auVar152._0_4_ = auVar17._0_4_;
      auVar152._4_4_ = auVar152._0_4_;
      auVar152._8_4_ = auVar152._0_4_;
      auVar152._12_4_ = auVar152._0_4_;
      auVar150 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar4,auVar152);
      auVar17 = vsubps_avx(_local_6f0,auVar13);
      auVar13 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar223._0_4_ = fVar118 * auVar13._0_4_;
      auVar223._4_4_ = fVar120 * auVar13._4_4_;
      auVar223._8_4_ = fVar148 * auVar13._8_4_;
      auVar223._12_4_ = fVar119 * auVar13._12_4_;
      auVar13 = vshufps_avx(auVar17,auVar17,0x55);
      auVar13 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar13);
      auVar15 = vblendps_avx(auVar150,local_750,8);
      auVar103._0_4_ = auVar17._0_4_;
      auVar103._4_4_ = auVar103._0_4_;
      auVar103._8_4_ = auVar103._0_4_;
      auVar103._12_4_ = auVar103._0_4_;
      auVar128 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar4,auVar103);
      auVar17 = vinsertps_avx(auVar128,auVar232,0x30);
      auVar13 = vandps_avx(auVar16,local_290);
      auVar14 = vandps_avx(auVar14,local_290);
      auVar16 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vandps_avx(auVar15,local_290);
      auVar14 = vandps_avx(auVar17,local_290);
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar16,auVar13);
      auVar14 = vmovshdup_avx(auVar13);
      auVar14 = vmaxss_avx(auVar14,auVar13);
      auVar13 = vshufpd_avx(auVar13,auVar13,1);
      auVar13 = vmaxss_avx(auVar13,auVar14);
      auVar14 = vmovshdup_avx(auVar102);
      uVar98 = auVar14._0_8_;
      local_5a0._8_8_ = uVar98;
      local_5a0._0_8_ = uVar98;
      local_5a0._16_8_ = uVar98;
      local_5a0._24_8_ = uVar98;
      auVar14 = vmovshdup_avx(auVar101);
      uVar98 = auVar14._0_8_;
      local_540._8_8_ = uVar98;
      local_540._0_8_ = uVar98;
      local_540._16_8_ = uVar98;
      local_540._24_8_ = uVar98;
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x908);
      auVar14 = vmovshdup_avx(auVar150);
      uVar98 = auVar14._0_8_;
      local_780._8_8_ = uVar98;
      local_780._0_8_ = uVar98;
      local_780._16_8_ = uVar98;
      local_780._24_8_ = uVar98;
      auVar14 = vmovshdup_avx(auVar128);
      uVar126 = auVar150._0_4_;
      auVar131._4_4_ = uVar126;
      auVar131._0_4_ = uVar126;
      auVar131._8_4_ = uVar126;
      auVar131._12_4_ = uVar126;
      auVar131._16_4_ = uVar126;
      auVar131._20_4_ = uVar126;
      auVar131._24_4_ = uVar126;
      auVar131._28_4_ = uVar126;
      local_340 = *(float *)(bezier_basis0 + lVar19 + 0xd8c);
      fStack_33c = *(float *)(bezier_basis0 + lVar19 + 0xd90);
      fStack_338 = *(float *)(bezier_basis0 + lVar19 + 0xd94);
      fStack_334 = *(float *)(bezier_basis0 + lVar19 + 0xd98);
      fStack_330 = *(float *)(bezier_basis0 + lVar19 + 0xd9c);
      fStack_32c = *(float *)(bezier_basis0 + lVar19 + 0xda0);
      fStack_328 = *(float *)(bezier_basis0 + lVar19 + 0xda4);
      local_7a0 = auVar128._0_4_;
      auVar176._0_4_ = local_340 * local_7a0;
      auVar176._4_4_ = fStack_33c * local_7a0;
      auVar176._8_4_ = fStack_338 * local_7a0;
      auVar176._12_4_ = fStack_334 * local_7a0;
      auVar176._16_4_ = fStack_330 * local_7a0;
      auVar176._20_4_ = fStack_32c * local_7a0;
      auVar176._24_4_ = fStack_328 * local_7a0;
      auVar176._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar176,auVar105,auVar131);
      fVar118 = auVar14._0_4_;
      auVar115._0_4_ = local_340 * fVar118;
      fVar120 = auVar14._4_4_;
      auVar115._4_4_ = fStack_33c * fVar120;
      auVar115._8_4_ = fStack_338 * fVar118;
      auVar115._12_4_ = fStack_334 * fVar120;
      auVar115._16_4_ = fStack_330 * fVar118;
      auVar115._20_4_ = fStack_32c * fVar120;
      auVar115._24_4_ = fStack_328 * fVar118;
      auVar115._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar115,auVar105,local_780);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x484);
      uVar203 = auVar101._0_4_;
      auVar197._4_4_ = uVar203;
      auVar197._0_4_ = uVar203;
      auVar197._8_4_ = uVar203;
      auVar197._12_4_ = uVar203;
      auVar197._16_4_ = uVar203;
      auVar197._20_4_ = uVar203;
      auVar197._24_4_ = uVar203;
      auVar197._28_4_ = uVar203;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar115,auVar197);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar115,local_540);
      auVar176 = *(undefined1 (*) [32])(bezier_basis0 + lVar19);
      uVar203 = auVar102._0_4_;
      auVar192._4_4_ = uVar203;
      auVar192._0_4_ = uVar203;
      auVar192._8_4_ = uVar203;
      auVar192._12_4_ = uVar203;
      auVar192._16_4_ = uVar203;
      auVar192._20_4_ = uVar203;
      auVar192._24_4_ = uVar203;
      auVar192._28_4_ = uVar203;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar176,auVar192);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar176,local_5a0);
      local_360 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x908);
      fVar148 = *(float *)(bezier_basis1 + lVar19 + 0xd8c);
      fVar119 = *(float *)(bezier_basis1 + lVar19 + 0xd90);
      fVar121 = *(float *)(bezier_basis1 + lVar19 + 0xd94);
      fVar122 = *(float *)(bezier_basis1 + lVar19 + 0xd98);
      fVar123 = *(float *)(bezier_basis1 + lVar19 + 0xd9c);
      fVar124 = *(float *)(bezier_basis1 + lVar19 + 0xda0);
      fVar125 = *(float *)(bezier_basis1 + lVar19 + 0xda4);
      auVar113._4_4_ = fVar119 * local_7a0;
      auVar113._0_4_ = fVar148 * local_7a0;
      auVar113._8_4_ = fVar121 * local_7a0;
      auVar113._12_4_ = fVar122 * local_7a0;
      auVar113._16_4_ = fVar123 * local_7a0;
      auVar113._20_4_ = fVar124 * local_7a0;
      auVar113._24_4_ = fVar125 * local_7a0;
      auVar113._28_4_ = local_7a0;
      auVar16 = vfmadd231ps_fma(auVar113,local_360,auVar131);
      auVar137._4_4_ = fVar119 * fVar120;
      auVar137._0_4_ = fVar148 * fVar118;
      auVar137._8_4_ = fVar121 * fVar118;
      auVar137._12_4_ = fVar122 * fVar120;
      auVar137._16_4_ = fVar123 * fVar118;
      auVar137._20_4_ = fVar124 * fVar120;
      auVar137._24_4_ = fVar125 * fVar118;
      auVar137._28_4_ = uVar126;
      auVar17 = vfmadd231ps_fma(auVar137,local_360,local_780);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x484);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar113,auVar197);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar113,local_540);
      auVar137 = *(undefined1 (*) [32])(bezier_basis1 + lVar19);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar137,auVar192);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar137,local_5a0);
      auVar106 = ZEXT1632(auVar16);
      auVar166 = ZEXT1632(auVar15);
      local_300 = vsubps_avx(auVar106,auVar166);
      auVar132 = ZEXT1632(auVar17);
      _local_2e0 = ZEXT1632(auVar14);
      local_320 = vsubps_avx(auVar132,_local_2e0);
      auVar107._0_4_ = auVar14._0_4_ * local_300._0_4_;
      auVar107._4_4_ = auVar14._4_4_ * local_300._4_4_;
      auVar107._8_4_ = auVar14._8_4_ * local_300._8_4_;
      auVar107._12_4_ = auVar14._12_4_ * local_300._12_4_;
      auVar107._16_4_ = local_300._16_4_ * 0.0;
      auVar107._20_4_ = local_300._20_4_ * 0.0;
      auVar107._24_4_ = local_300._24_4_ * 0.0;
      auVar107._28_4_ = 0;
      fVar222 = local_320._0_4_;
      auVar133._0_4_ = fVar222 * auVar15._0_4_;
      fVar228 = local_320._4_4_;
      auVar133._4_4_ = fVar228 * auVar15._4_4_;
      fVar234 = local_320._8_4_;
      auVar133._8_4_ = fVar234 * auVar15._8_4_;
      fVar235 = local_320._12_4_;
      auVar133._12_4_ = fVar235 * auVar15._12_4_;
      fVar236 = local_320._16_4_;
      auVar133._16_4_ = fVar236 * 0.0;
      fVar237 = local_320._20_4_;
      auVar133._20_4_ = fVar237 * 0.0;
      fVar238 = local_320._24_4_;
      auVar133._24_4_ = fVar238 * 0.0;
      auVar133._28_4_ = 0;
      auVar107 = vsubps_avx(auVar107,auVar133);
      auVar14 = vpermilps_avx(local_740,0xff);
      uVar98 = auVar14._0_8_;
      local_80._8_8_ = uVar98;
      local_80._0_8_ = uVar98;
      local_80._16_8_ = uVar98;
      local_80._24_8_ = uVar98;
      auVar15 = vpermilps_avx(local_750,0xff);
      local_a0._0_8_ = auVar15._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      auVar179 = ZEXT3264(_local_240);
      fStack_324 = (float)*(undefined4 *)(bezier_basis0 + lVar19 + 0xda8);
      auVar214._4_4_ = fStack_33c * fVar149;
      auVar214._0_4_ = local_340 * fVar149;
      auVar214._8_4_ = fStack_338 * fVar149;
      auVar214._12_4_ = fStack_334 * fVar149;
      auVar214._16_4_ = fStack_330 * fVar149;
      auVar214._20_4_ = fStack_32c * fVar149;
      auVar214._24_4_ = fStack_328 * fVar149;
      auVar214._28_4_ = *(undefined4 *)(bezier_basis0 + lVar19 + 0xda8);
      auVar15 = vfmadd231ps_fma(auVar214,local_a0,auVar105);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar115,local_80);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar176,local_220);
      auVar210._4_4_ = fVar119 * fVar149;
      auVar210._0_4_ = fVar148 * fVar149;
      auVar210._8_4_ = fVar121 * fVar149;
      auVar210._12_4_ = fVar122 * fVar149;
      auVar210._16_4_ = fVar123 * fVar149;
      auVar210._20_4_ = fVar124 * fVar149;
      auVar210._24_4_ = fVar125 * fVar149;
      auVar210._28_4_ = auVar176._28_4_;
      auVar16 = vfmadd231ps_fma(auVar210,local_360,local_a0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar113,local_80);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar137,local_220);
      auVar18._4_4_ = fVar228 * fVar228;
      auVar18._0_4_ = fVar222 * fVar222;
      auVar18._8_4_ = fVar234 * fVar234;
      auVar18._12_4_ = fVar235 * fVar235;
      auVar18._16_4_ = fVar236 * fVar236;
      auVar18._20_4_ = fVar237 * fVar237;
      auVar18._24_4_ = fVar238 * fVar238;
      auVar18._28_4_ = auVar14._4_4_;
      auVar14 = vfmadd231ps_fma(auVar18,local_300,local_300);
      auVar214 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
      auVar11._4_4_ = auVar214._4_4_ * auVar214._4_4_ * auVar14._4_4_;
      auVar11._0_4_ = auVar214._0_4_ * auVar214._0_4_ * auVar14._0_4_;
      auVar11._8_4_ = auVar214._8_4_ * auVar214._8_4_ * auVar14._8_4_;
      auVar11._12_4_ = auVar214._12_4_ * auVar214._12_4_ * auVar14._12_4_;
      auVar11._16_4_ = auVar214._16_4_ * auVar214._16_4_ * 0.0;
      auVar11._20_4_ = auVar214._20_4_ * auVar214._20_4_ * 0.0;
      auVar11._24_4_ = auVar214._24_4_ * auVar214._24_4_ * 0.0;
      auVar11._28_4_ = auVar214._28_4_;
      auVar140._4_4_ = auVar107._4_4_ * auVar107._4_4_;
      auVar140._0_4_ = auVar107._0_4_ * auVar107._0_4_;
      auVar140._8_4_ = auVar107._8_4_ * auVar107._8_4_;
      auVar140._12_4_ = auVar107._12_4_ * auVar107._12_4_;
      auVar140._16_4_ = auVar107._16_4_ * auVar107._16_4_;
      auVar140._20_4_ = auVar107._20_4_ * auVar107._20_4_;
      auVar140._24_4_ = auVar107._24_4_ * auVar107._24_4_;
      auVar140._28_4_ = 0;
      auVar214 = vcmpps_avx(auVar140,auVar11,2);
      fVar149 = auVar13._0_4_ * 4.7683716e-07;
      auVar108._0_4_ = (float)iVar91;
      _auStack_51c = auVar128._4_12_;
      auVar108._4_4_ = auVar108._0_4_;
      auVar108._8_4_ = auVar108._0_4_;
      auVar108._12_4_ = auVar108._0_4_;
      auVar108._16_4_ = auVar108._0_4_;
      auVar108._20_4_ = auVar108._0_4_;
      auVar108._24_4_ = auVar108._0_4_;
      auVar108._28_4_ = auVar108._0_4_;
      auVar210 = vcmpps_avx(_DAT_02020f40,auVar108,1);
      auVar13 = vpermilps_avx(auVar102,0xaa);
      uVar98 = auVar13._0_8_;
      local_680._8_8_ = uVar98;
      local_680._0_8_ = uVar98;
      local_680._16_8_ = uVar98;
      local_680._24_8_ = uVar98;
      auVar13 = vpermilps_avx(auVar101,0xaa);
      uVar98 = auVar13._0_8_;
      local_260._8_8_ = uVar98;
      local_260._0_8_ = uVar98;
      local_260._16_8_ = uVar98;
      local_260._24_8_ = uVar98;
      auVar13 = vpermilps_avx(auVar150,0xaa);
      uVar98 = auVar13._0_8_;
      local_2c0._8_8_ = uVar98;
      local_2c0._0_8_ = uVar98;
      local_2c0._16_8_ = uVar98;
      local_2c0._24_8_ = uVar98;
      auVar13 = vshufps_avx(auVar128,auVar128,0xaa);
      uVar98 = auVar13._0_8_;
      register0x00001508 = uVar98;
      local_6e0 = uVar98;
      register0x00001510 = uVar98;
      register0x00001518 = uVar98;
      auVar226 = ZEXT3264(_local_6e0);
      auVar18 = auVar210 & auVar214;
      uVar95 = *(uint *)(ray + k * 4 + 0x60);
      local_7c0._0_16_ = ZEXT416(uVar95);
      local_800 = auVar12._0_8_;
      uStack_7f8 = auVar12._8_8_;
      fStack_79c = local_7a0;
      fStack_798 = local_7a0;
      fStack_794 = local_7a0;
      fStack_790 = local_7a0;
      fStack_78c = local_7a0;
      fStack_788 = local_7a0;
      fStack_784 = local_7a0;
      local_520 = auVar108._0_4_;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar18 >> 0x7f,0) == '\0') &&
            (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar18 >> 0xbf,0) == '\0') &&
          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar18[0x1f])
      {
        auVar146 = ZEXT3264(local_780);
        auVar202 = ZEXT3264(CONCAT428(local_7a0,
                                      CONCAT424(local_7a0,
                                                CONCAT420(local_7a0,
                                                          CONCAT416(local_7a0,
                                                                    CONCAT412(local_7a0,
                                                                              CONCAT48(local_7a0,
                                                                                       CONCAT44(
                                                  local_7a0,local_7a0))))))));
      }
      else {
        local_380 = vandps_avx(auVar214,auVar210);
        fVar222 = auVar13._0_4_;
        fVar228 = auVar13._4_4_;
        auVar229._4_4_ = fVar228 * fVar119;
        auVar229._0_4_ = fVar222 * fVar148;
        auVar229._8_4_ = fVar222 * fVar121;
        auVar229._12_4_ = fVar228 * fVar122;
        auVar229._16_4_ = fVar222 * fVar123;
        auVar229._20_4_ = fVar228 * fVar124;
        auVar229._24_4_ = fVar222 * fVar125;
        auVar229._28_4_ = local_380._28_4_;
        auVar13 = vfmadd213ps_fma(local_360,local_2c0,auVar229);
        auVar13 = vfmadd213ps_fma(auVar113,local_260,ZEXT1632(auVar13));
        auVar13 = vfmadd213ps_fma(auVar137,local_680,ZEXT1632(auVar13));
        auVar109._0_4_ = fVar222 * local_340;
        auVar109._4_4_ = fVar228 * fStack_33c;
        auVar109._8_4_ = fVar222 * fStack_338;
        auVar109._12_4_ = fVar228 * fStack_334;
        auVar109._16_4_ = fVar222 * fStack_330;
        auVar109._20_4_ = fVar228 * fStack_32c;
        auVar109._24_4_ = fVar222 * fStack_328;
        auVar109._28_4_ = 0;
        auVar14 = vfmadd213ps_fma(auVar105,local_2c0,auVar109);
        auVar14 = vfmadd213ps_fma(auVar115,local_260,ZEXT1632(auVar14));
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1b18);
        fVar148 = *(float *)(bezier_basis0 + lVar19 + 0x1f9c);
        fVar119 = *(float *)(bezier_basis0 + lVar19 + 0x1fa0);
        fVar121 = *(float *)(bezier_basis0 + lVar19 + 0x1fa4);
        fVar122 = *(float *)(bezier_basis0 + lVar19 + 0x1fa8);
        fVar123 = *(float *)(bezier_basis0 + lVar19 + 0x1fac);
        fVar124 = *(float *)(bezier_basis0 + lVar19 + 0x1fb0);
        fVar125 = *(float *)(bezier_basis0 + lVar19 + 0x1fb4);
        auVar20._4_4_ = local_7a0 * fVar119;
        auVar20._0_4_ = local_7a0 * fVar148;
        auVar20._8_4_ = local_7a0 * fVar121;
        auVar20._12_4_ = local_7a0 * fVar122;
        auVar20._16_4_ = local_7a0 * fVar123;
        auVar20._20_4_ = local_7a0 * fVar124;
        auVar20._24_4_ = local_7a0 * fVar125;
        auVar20._28_4_ = auVar107._28_4_;
        auVar209._0_4_ = fVar148 * fVar118;
        auVar209._4_4_ = fVar119 * fVar120;
        auVar209._8_4_ = fVar121 * fVar118;
        auVar209._12_4_ = fVar122 * fVar120;
        auVar209._16_4_ = fVar123 * fVar118;
        auVar209._20_4_ = fVar124 * fVar120;
        auVar209._24_4_ = fVar125 * fVar118;
        auVar209._28_4_ = 0;
        auVar21._4_4_ = fVar119 * fVar228;
        auVar21._0_4_ = fVar148 * fVar222;
        auVar21._8_4_ = fVar121 * fVar222;
        auVar21._12_4_ = fVar122 * fVar228;
        auVar21._16_4_ = fVar123 * fVar222;
        auVar21._20_4_ = fVar124 * fVar228;
        auVar21._24_4_ = fVar125 * fVar222;
        auVar21._28_4_ = *(undefined4 *)(bezier_basis1 + lVar19 + 0xda8);
        auVar17 = vfmadd231ps_fma(auVar20,auVar113,auVar131);
        auVar102 = vfmadd231ps_fma(auVar209,auVar113,local_780);
        auVar101 = vfmadd231ps_fma(auVar21,local_2c0,auVar113);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar115,auVar197);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar115,local_540);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),local_260,auVar115);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar105,auVar192);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar105,local_5a0);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar105,local_680);
        fVar148 = *(float *)(bezier_basis1 + lVar19 + 0x1f9c);
        fVar119 = *(float *)(bezier_basis1 + lVar19 + 0x1fa0);
        fVar121 = *(float *)(bezier_basis1 + lVar19 + 0x1fa4);
        fVar122 = *(float *)(bezier_basis1 + lVar19 + 0x1fa8);
        fVar123 = *(float *)(bezier_basis1 + lVar19 + 0x1fac);
        fVar124 = *(float *)(bezier_basis1 + lVar19 + 0x1fb0);
        fVar125 = *(float *)(bezier_basis1 + lVar19 + 0x1fb4);
        auVar219._0_4_ = local_7a0 * fVar148;
        auVar219._4_4_ = local_7a0 * fVar119;
        auVar219._8_4_ = local_7a0 * fVar121;
        auVar219._12_4_ = local_7a0 * fVar122;
        auVar219._16_4_ = local_7a0 * fVar123;
        auVar219._20_4_ = local_7a0 * fVar124;
        auVar219._24_4_ = local_7a0 * fVar125;
        auVar219._28_4_ = 0;
        auVar22._4_4_ = fVar120 * fVar119;
        auVar22._0_4_ = fVar118 * fVar148;
        auVar22._8_4_ = fVar118 * fVar121;
        auVar22._12_4_ = fVar120 * fVar122;
        auVar22._16_4_ = fVar118 * fVar123;
        auVar22._20_4_ = fVar120 * fVar124;
        auVar22._24_4_ = fVar118 * fVar125;
        auVar22._28_4_ = local_7a0;
        auVar23._4_4_ = fVar228 * fVar119;
        auVar23._0_4_ = fVar222 * fVar148;
        auVar23._8_4_ = fVar222 * fVar121;
        auVar23._12_4_ = fVar228 * fVar122;
        auVar23._16_4_ = fVar222 * fVar123;
        auVar23._20_4_ = fVar228 * fVar124;
        auVar23._24_4_ = fVar222 * fVar125;
        auVar23._28_4_ = fVar228;
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1b18);
        auVar150 = vfmadd231ps_fma(auVar219,auVar105,auVar131);
        auVar128 = vfmadd231ps_fma(auVar22,auVar105,local_780);
        auVar100 = vfmadd231ps_fma(auVar23,local_2c0,auVar105);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1694);
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar105,auVar197);
        auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar105,local_540);
        auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),local_260,auVar105);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1210);
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar105,auVar192);
        auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar105,local_5a0);
        auVar134._8_4_ = 0x7fffffff;
        auVar134._0_8_ = 0x7fffffff7fffffff;
        auVar134._12_4_ = 0x7fffffff;
        auVar134._16_4_ = 0x7fffffff;
        auVar134._20_4_ = 0x7fffffff;
        auVar134._24_4_ = 0x7fffffff;
        auVar134._28_4_ = 0x7fffffff;
        auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),local_680,auVar105);
        auVar105 = vandps_avx(ZEXT1632(auVar17),auVar134);
        auVar115 = vandps_avx(ZEXT1632(auVar102),auVar134);
        auVar115 = vmaxps_avx(auVar105,auVar115);
        auVar105 = vandps_avx(ZEXT1632(auVar101),auVar134);
        auVar105 = vmaxps_avx(auVar115,auVar105);
        auVar163._4_4_ = fVar149;
        auVar163._0_4_ = fVar149;
        auVar163._8_4_ = fVar149;
        auVar163._12_4_ = fVar149;
        auVar163._16_4_ = fVar149;
        auVar163._20_4_ = fVar149;
        auVar163._24_4_ = fVar149;
        auVar163._28_4_ = fVar149;
        auVar105 = vcmpps_avx(auVar105,auVar163,1);
        auVar113 = vblendvps_avx(ZEXT1632(auVar17),local_300,auVar105);
        auVar137 = vblendvps_avx(ZEXT1632(auVar102),local_320,auVar105);
        auVar105 = vandps_avx(ZEXT1632(auVar150),auVar134);
        auVar115 = vandps_avx(ZEXT1632(auVar128),auVar134);
        auVar115 = vmaxps_avx(auVar105,auVar115);
        auVar105 = vandps_avx(ZEXT1632(auVar100),auVar134);
        auVar105 = vmaxps_avx(auVar115,auVar105);
        auVar214 = vcmpps_avx(auVar105,auVar163,1);
        auVar105 = vblendvps_avx(ZEXT1632(auVar150),local_300,auVar214);
        auVar115 = vblendvps_avx(ZEXT1632(auVar128),local_320,auVar214);
        auVar14 = vfmadd213ps_fma(auVar176,local_680,ZEXT1632(auVar14));
        auVar17 = vfmadd213ps_fma(auVar113,auVar113,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar137,auVar137);
        auVar176 = vrsqrtps_avx(ZEXT1632(auVar17));
        fVar148 = auVar176._0_4_;
        fVar119 = auVar176._4_4_;
        fVar121 = auVar176._8_4_;
        fVar122 = auVar176._12_4_;
        fVar123 = auVar176._16_4_;
        fVar124 = auVar176._20_4_;
        fVar125 = auVar176._24_4_;
        auVar24._4_4_ = fVar119 * fVar119 * fVar119 * auVar17._4_4_ * -0.5;
        auVar24._0_4_ = fVar148 * fVar148 * fVar148 * auVar17._0_4_ * -0.5;
        auVar24._8_4_ = fVar121 * fVar121 * fVar121 * auVar17._8_4_ * -0.5;
        auVar24._12_4_ = fVar122 * fVar122 * fVar122 * auVar17._12_4_ * -0.5;
        auVar24._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar24._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar24._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar24._28_4_ = 0;
        auVar220._8_4_ = 0x3fc00000;
        auVar220._0_8_ = 0x3fc000003fc00000;
        auVar220._12_4_ = 0x3fc00000;
        auVar220._16_4_ = 0x3fc00000;
        auVar220._20_4_ = 0x3fc00000;
        auVar220._24_4_ = 0x3fc00000;
        auVar220._28_4_ = 0x3fc00000;
        auVar17 = vfmadd231ps_fma(auVar24,auVar220,auVar176);
        fVar148 = auVar17._0_4_;
        fVar119 = auVar17._4_4_;
        auVar25._4_4_ = auVar137._4_4_ * fVar119;
        auVar25._0_4_ = auVar137._0_4_ * fVar148;
        fVar121 = auVar17._8_4_;
        auVar25._8_4_ = auVar137._8_4_ * fVar121;
        fVar122 = auVar17._12_4_;
        auVar25._12_4_ = auVar137._12_4_ * fVar122;
        auVar25._16_4_ = auVar137._16_4_ * 0.0;
        auVar25._20_4_ = auVar137._20_4_ * 0.0;
        auVar25._24_4_ = auVar137._24_4_ * 0.0;
        auVar25._28_4_ = auVar176._28_4_;
        auVar26._4_4_ = -auVar113._4_4_ * fVar119;
        auVar26._0_4_ = -auVar113._0_4_ * fVar148;
        auVar26._8_4_ = -auVar113._8_4_ * fVar121;
        auVar26._12_4_ = -auVar113._12_4_ * fVar122;
        auVar26._16_4_ = -auVar113._16_4_ * 0.0;
        auVar26._20_4_ = -auVar113._20_4_ * 0.0;
        auVar26._24_4_ = -auVar113._24_4_ * 0.0;
        auVar26._28_4_ = 0x80000000;
        auVar17 = vfmadd213ps_fma(auVar105,auVar105,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar115,auVar115);
        auVar176 = vrsqrtps_avx(ZEXT1632(auVar17));
        auVar27._28_4_ = auVar214._28_4_;
        auVar27._0_28_ =
             ZEXT1628(CONCAT412(fVar122 * 0.0,
                                CONCAT48(fVar121 * 0.0,CONCAT44(fVar119 * 0.0,fVar148 * 0.0))));
        fVar148 = auVar176._0_4_;
        fVar119 = auVar176._4_4_;
        fVar121 = auVar176._8_4_;
        fVar122 = auVar176._12_4_;
        fVar123 = auVar176._16_4_;
        fVar124 = auVar176._20_4_;
        fVar125 = auVar176._24_4_;
        auVar28._4_4_ = fVar119 * fVar119 * fVar119 * auVar17._4_4_ * -0.5;
        auVar28._0_4_ = fVar148 * fVar148 * fVar148 * auVar17._0_4_ * -0.5;
        auVar28._8_4_ = fVar121 * fVar121 * fVar121 * auVar17._8_4_ * -0.5;
        auVar28._12_4_ = fVar122 * fVar122 * fVar122 * auVar17._12_4_ * -0.5;
        auVar28._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar28._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar28._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar28._28_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar28,auVar220,auVar176);
        fVar148 = auVar17._0_4_;
        fVar119 = auVar17._4_4_;
        auVar29._4_4_ = auVar115._4_4_ * fVar119;
        auVar29._0_4_ = auVar115._0_4_ * fVar148;
        fVar121 = auVar17._8_4_;
        auVar29._8_4_ = auVar115._8_4_ * fVar121;
        fVar122 = auVar17._12_4_;
        auVar29._12_4_ = auVar115._12_4_ * fVar122;
        auVar29._16_4_ = auVar115._16_4_ * 0.0;
        auVar29._20_4_ = auVar115._20_4_ * 0.0;
        auVar29._24_4_ = auVar115._24_4_ * 0.0;
        auVar29._28_4_ = auVar115._28_4_;
        auVar30._4_4_ = fVar119 * -auVar105._4_4_;
        auVar30._0_4_ = fVar148 * -auVar105._0_4_;
        auVar30._8_4_ = fVar121 * -auVar105._8_4_;
        auVar30._12_4_ = fVar122 * -auVar105._12_4_;
        auVar30._16_4_ = -auVar105._16_4_ * 0.0;
        auVar30._20_4_ = -auVar105._20_4_ * 0.0;
        auVar30._24_4_ = -auVar105._24_4_ * 0.0;
        auVar30._28_4_ = auVar113._28_4_ ^ 0x80000000;
        auVar31._28_4_ = auVar176._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar122 * 0.0,
                                CONCAT48(fVar121 * 0.0,CONCAT44(fVar119 * 0.0,fVar148 * 0.0))));
        auVar17 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar15),auVar166);
        auVar229 = ZEXT1632(auVar15);
        auVar15 = vfmadd213ps_fma(auVar26,auVar229,_local_2e0);
        auVar102 = vfmadd213ps_fma(auVar27,auVar229,ZEXT1632(auVar14));
        auVar100 = vfnmadd213ps_fma(auVar25,auVar229,auVar166);
        auVar101 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar16),auVar106);
        auVar129 = vfnmadd213ps_fma(auVar26,auVar229,_local_2e0);
        auVar105 = ZEXT1632(auVar16);
        auVar150 = vfmadd213ps_fma(auVar30,auVar105,auVar132);
        auVar99 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar229,auVar27);
        auVar14 = vfmadd213ps_fma(auVar31,auVar105,ZEXT1632(auVar13));
        auVar170 = vfnmadd213ps_fma(auVar29,auVar105,auVar106);
        auVar181 = vfnmadd213ps_fma(auVar30,auVar105,auVar132);
        auVar127 = vfnmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar16),auVar31);
        auVar105 = vsubps_avx(ZEXT1632(auVar150),ZEXT1632(auVar129));
        auVar115 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar99));
        auVar106._4_4_ = auVar99._4_4_ * auVar105._4_4_;
        auVar106._0_4_ = auVar99._0_4_ * auVar105._0_4_;
        auVar106._8_4_ = auVar99._8_4_ * auVar105._8_4_;
        auVar106._12_4_ = auVar99._12_4_ * auVar105._12_4_;
        auVar106._16_4_ = auVar105._16_4_ * 0.0;
        auVar106._20_4_ = auVar105._20_4_ * 0.0;
        auVar106._24_4_ = auVar105._24_4_ * 0.0;
        auVar106._28_4_ = 0;
        auVar128 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar129),auVar115);
        auVar132._4_4_ = auVar100._4_4_ * auVar115._4_4_;
        auVar132._0_4_ = auVar100._0_4_ * auVar115._0_4_;
        auVar132._8_4_ = auVar100._8_4_ * auVar115._8_4_;
        auVar132._12_4_ = auVar100._12_4_ * auVar115._12_4_;
        auVar132._16_4_ = auVar115._16_4_ * 0.0;
        auVar132._20_4_ = auVar115._20_4_ * 0.0;
        auVar132._24_4_ = auVar115._24_4_ * 0.0;
        auVar132._28_4_ = auVar115._28_4_;
        auVar210 = ZEXT1632(auVar100);
        auVar115 = vsubps_avx(ZEXT1632(auVar101),auVar210);
        auVar13 = vfmsub231ps_fma(auVar132,ZEXT1632(auVar99),auVar115);
        auVar166._4_4_ = auVar129._4_4_ * auVar115._4_4_;
        auVar166._0_4_ = auVar129._0_4_ * auVar115._0_4_;
        auVar166._8_4_ = auVar129._8_4_ * auVar115._8_4_;
        auVar166._12_4_ = auVar129._12_4_ * auVar115._12_4_;
        auVar166._16_4_ = auVar115._16_4_ * 0.0;
        auVar166._20_4_ = auVar115._20_4_ * 0.0;
        auVar166._24_4_ = auVar115._24_4_ * 0.0;
        auVar166._28_4_ = auVar115._28_4_;
        auVar100 = vfmsub231ps_fma(auVar166,auVar210,auVar105);
        auVar105 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar105,ZEXT1632(auVar13));
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar105,ZEXT1632(auVar128));
        auVar11 = vcmpps_avx(ZEXT1632(auVar13),ZEXT1232(ZEXT812(0)) << 0x20,2);
        auVar179 = ZEXT3264(auVar11);
        auVar105 = vblendvps_avx(ZEXT1632(auVar170),ZEXT1632(auVar17),auVar11);
        auVar115 = vblendvps_avx(ZEXT1632(auVar181),ZEXT1632(auVar15),auVar11);
        auVar176 = vblendvps_avx(ZEXT1632(auVar127),ZEXT1632(auVar102),auVar11);
        auVar113 = vblendvps_avx(auVar210,ZEXT1632(auVar101),auVar11);
        auVar137 = vblendvps_avx(ZEXT1632(auVar129),ZEXT1632(auVar150),auVar11);
        auVar214 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar14),auVar11);
        auVar210 = vblendvps_avx(ZEXT1632(auVar101),auVar210,auVar11);
        auVar107 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar129),auVar11);
        auVar13 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
        auVar18 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar99),auVar11);
        auVar140 = vsubps_avx(auVar210,auVar105);
        auVar107 = vsubps_avx(auVar107,auVar115);
        auVar106 = vsubps_avx(auVar18,auVar176);
        auVar132 = vsubps_avx(auVar105,auVar113);
        auVar133 = vsubps_avx(auVar115,auVar137);
        auVar166 = vsubps_avx(auVar176,auVar214);
        auVar32._4_4_ = auVar106._4_4_ * auVar105._4_4_;
        auVar32._0_4_ = auVar106._0_4_ * auVar105._0_4_;
        auVar32._8_4_ = auVar106._8_4_ * auVar105._8_4_;
        auVar32._12_4_ = auVar106._12_4_ * auVar105._12_4_;
        auVar32._16_4_ = auVar106._16_4_ * auVar105._16_4_;
        auVar32._20_4_ = auVar106._20_4_ * auVar105._20_4_;
        auVar32._24_4_ = auVar106._24_4_ * auVar105._24_4_;
        auVar32._28_4_ = auVar18._28_4_;
        auVar14 = vfmsub231ps_fma(auVar32,auVar176,auVar140);
        auVar33._4_4_ = auVar140._4_4_ * auVar115._4_4_;
        auVar33._0_4_ = auVar140._0_4_ * auVar115._0_4_;
        auVar33._8_4_ = auVar140._8_4_ * auVar115._8_4_;
        auVar33._12_4_ = auVar140._12_4_ * auVar115._12_4_;
        auVar33._16_4_ = auVar140._16_4_ * auVar115._16_4_;
        auVar33._20_4_ = auVar140._20_4_ * auVar115._20_4_;
        auVar33._24_4_ = auVar140._24_4_ * auVar115._24_4_;
        auVar33._28_4_ = auVar210._28_4_;
        auVar15 = vfmsub231ps_fma(auVar33,auVar105,auVar107);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar110._0_4_ = auVar107._0_4_ * auVar176._0_4_;
        auVar110._4_4_ = auVar107._4_4_ * auVar176._4_4_;
        auVar110._8_4_ = auVar107._8_4_ * auVar176._8_4_;
        auVar110._12_4_ = auVar107._12_4_ * auVar176._12_4_;
        auVar110._16_4_ = auVar107._16_4_ * auVar176._16_4_;
        auVar110._20_4_ = auVar107._20_4_ * auVar176._20_4_;
        auVar110._24_4_ = auVar107._24_4_ * auVar176._24_4_;
        auVar110._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar110,auVar115,auVar106);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar111._0_4_ = auVar166._0_4_ * auVar113._0_4_;
        auVar111._4_4_ = auVar166._4_4_ * auVar113._4_4_;
        auVar111._8_4_ = auVar166._8_4_ * auVar113._8_4_;
        auVar111._12_4_ = auVar166._12_4_ * auVar113._12_4_;
        auVar111._16_4_ = auVar166._16_4_ * auVar113._16_4_;
        auVar111._20_4_ = auVar166._20_4_ * auVar113._20_4_;
        auVar111._24_4_ = auVar166._24_4_ * auVar113._24_4_;
        auVar111._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar111,auVar132,auVar214);
        auVar34._4_4_ = auVar133._4_4_ * auVar214._4_4_;
        auVar34._0_4_ = auVar133._0_4_ * auVar214._0_4_;
        auVar34._8_4_ = auVar133._8_4_ * auVar214._8_4_;
        auVar34._12_4_ = auVar133._12_4_ * auVar214._12_4_;
        auVar34._16_4_ = auVar133._16_4_ * auVar214._16_4_;
        auVar34._20_4_ = auVar133._20_4_ * auVar214._20_4_;
        auVar34._24_4_ = auVar133._24_4_ * auVar214._24_4_;
        auVar34._28_4_ = auVar214._28_4_;
        auVar17 = vfmsub231ps_fma(auVar34,auVar137,auVar166);
        auVar35._4_4_ = auVar132._4_4_ * auVar137._4_4_;
        auVar35._0_4_ = auVar132._0_4_ * auVar137._0_4_;
        auVar35._8_4_ = auVar132._8_4_ * auVar137._8_4_;
        auVar35._12_4_ = auVar132._12_4_ * auVar137._12_4_;
        auVar35._16_4_ = auVar132._16_4_ * auVar137._16_4_;
        auVar35._20_4_ = auVar132._20_4_ * auVar137._20_4_;
        auVar35._24_4_ = auVar132._24_4_ * auVar137._24_4_;
        auVar35._28_4_ = auVar137._28_4_;
        auVar102 = vfmsub231ps_fma(auVar35,auVar133,auVar113);
        auVar137 = ZEXT832(0) << 0x20;
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar137,ZEXT1632(auVar14));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar137,ZEXT1632(auVar17));
        auVar113 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar17));
        auVar113 = vcmpps_avx(auVar113,ZEXT832(0) << 0x20,2);
        auVar14 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
        auVar13 = vpand_avx(auVar14,auVar13);
        auVar113 = vpmovsxwd_avx2(auVar13);
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0x7f,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar113 >> 0xbf,0) == '\0') &&
            (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar113[0x1f]) {
LAB_016a2e8a:
          auVar202 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar217 = ZEXT3264(local_640);
          auVar146 = ZEXT3264(local_660);
        }
        else {
          auVar36._4_4_ = auVar107._4_4_ * auVar166._4_4_;
          auVar36._0_4_ = auVar107._0_4_ * auVar166._0_4_;
          auVar36._8_4_ = auVar107._8_4_ * auVar166._8_4_;
          auVar36._12_4_ = auVar107._12_4_ * auVar166._12_4_;
          auVar36._16_4_ = auVar107._16_4_ * auVar166._16_4_;
          auVar36._20_4_ = auVar107._20_4_ * auVar166._20_4_;
          auVar36._24_4_ = auVar107._24_4_ * auVar166._24_4_;
          auVar36._28_4_ = auVar113._28_4_;
          auVar150 = vfmsub231ps_fma(auVar36,auVar133,auVar106);
          auVar135._0_4_ = auVar132._0_4_ * auVar106._0_4_;
          auVar135._4_4_ = auVar132._4_4_ * auVar106._4_4_;
          auVar135._8_4_ = auVar132._8_4_ * auVar106._8_4_;
          auVar135._12_4_ = auVar132._12_4_ * auVar106._12_4_;
          auVar135._16_4_ = auVar132._16_4_ * auVar106._16_4_;
          auVar135._20_4_ = auVar132._20_4_ * auVar106._20_4_;
          auVar135._24_4_ = auVar132._24_4_ * auVar106._24_4_;
          auVar135._28_4_ = 0;
          auVar101 = vfmsub231ps_fma(auVar135,auVar140,auVar166);
          auVar37._4_4_ = auVar140._4_4_ * auVar133._4_4_;
          auVar37._0_4_ = auVar140._0_4_ * auVar133._0_4_;
          auVar37._8_4_ = auVar140._8_4_ * auVar133._8_4_;
          auVar37._12_4_ = auVar140._12_4_ * auVar133._12_4_;
          auVar37._16_4_ = auVar140._16_4_ * auVar133._16_4_;
          auVar37._20_4_ = auVar140._20_4_ * auVar133._20_4_;
          auVar37._24_4_ = auVar140._24_4_ * auVar133._24_4_;
          auVar37._28_4_ = auVar140._28_4_;
          auVar128 = vfmsub231ps_fma(auVar37,auVar132,auVar107);
          auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar101),ZEXT1632(auVar128));
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar150),auVar137);
          auVar113 = vrcpps_avx(ZEXT1632(auVar102));
          auVar221._8_4_ = 0x3f800000;
          auVar221._0_8_ = &DAT_3f8000003f800000;
          auVar221._12_4_ = 0x3f800000;
          auVar221._16_4_ = 0x3f800000;
          auVar221._20_4_ = 0x3f800000;
          auVar221._24_4_ = 0x3f800000;
          auVar221._28_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar113,ZEXT1632(auVar102),auVar221);
          auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar113,auVar113);
          auVar193._0_4_ = auVar176._0_4_ * auVar128._0_4_;
          auVar193._4_4_ = auVar176._4_4_ * auVar128._4_4_;
          auVar193._8_4_ = auVar176._8_4_ * auVar128._8_4_;
          auVar193._12_4_ = auVar176._12_4_ * auVar128._12_4_;
          auVar193._16_4_ = auVar176._16_4_ * 0.0;
          auVar193._20_4_ = auVar176._20_4_ * 0.0;
          auVar193._24_4_ = auVar176._24_4_ * 0.0;
          auVar193._28_4_ = 0;
          auVar101 = vfmadd231ps_fma(auVar193,auVar115,ZEXT1632(auVar101));
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar150),auVar105);
          fVar148 = auVar14._0_4_;
          fVar119 = auVar14._4_4_;
          fVar121 = auVar14._8_4_;
          fVar122 = auVar14._12_4_;
          auVar176 = ZEXT1632(CONCAT412(fVar122 * auVar101._12_4_,
                                        CONCAT48(fVar121 * auVar101._8_4_,
                                                 CONCAT44(fVar119 * auVar101._4_4_,
                                                          fVar148 * auVar101._0_4_))));
          auVar112._4_4_ = uVar95;
          auVar112._0_4_ = uVar95;
          auVar112._8_4_ = uVar95;
          auVar112._12_4_ = uVar95;
          auVar112._16_4_ = uVar95;
          auVar112._20_4_ = uVar95;
          auVar112._24_4_ = uVar95;
          auVar112._28_4_ = uVar95;
          uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar136._4_4_ = uVar126;
          auVar136._0_4_ = uVar126;
          auVar136._8_4_ = uVar126;
          auVar136._12_4_ = uVar126;
          auVar136._16_4_ = uVar126;
          auVar136._20_4_ = uVar126;
          auVar136._24_4_ = uVar126;
          auVar136._28_4_ = uVar126;
          auVar105 = vcmpps_avx(auVar112,auVar176,2);
          auVar115 = vcmpps_avx(auVar176,auVar136,2);
          auVar105 = vandps_avx(auVar115,auVar105);
          auVar14 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
          auVar13 = vpand_avx(auVar13,auVar14);
          auVar105 = vpmovsxwd_avx2(auVar13);
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar105 >> 0x7f,0) == '\0') &&
                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0xbf,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar105[0x1f]) goto LAB_016a2e8a;
          auVar105 = vcmpps_avx(auVar137,ZEXT1632(auVar102),4);
          auVar14 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
          auVar13 = vpand_avx(auVar13,auVar14);
          auVar105 = vpmovsxwd_avx2(auVar13);
          auVar202 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar217 = ZEXT3264(local_640);
          auVar146 = ZEXT3264(local_660);
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar105 >> 0x7f,0) != '\0') ||
                (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0xbf,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar105[0x1f] < '\0') {
            auVar113 = ZEXT1632(CONCAT412(fVar122 * auVar15._12_4_,
                                          CONCAT48(fVar121 * auVar15._8_4_,
                                                   CONCAT44(fVar119 * auVar15._4_4_,
                                                            fVar148 * auVar15._0_4_))));
            auVar137 = ZEXT1632(CONCAT412(fVar122 * auVar17._12_4_,
                                          CONCAT48(fVar121 * auVar17._8_4_,
                                                   CONCAT44(fVar119 * auVar17._4_4_,
                                                            fVar148 * auVar17._0_4_))));
            auVar184._8_4_ = 0x3f800000;
            auVar184._0_8_ = &DAT_3f8000003f800000;
            auVar184._12_4_ = 0x3f800000;
            auVar184._16_4_ = 0x3f800000;
            auVar184._20_4_ = 0x3f800000;
            auVar184._24_4_ = 0x3f800000;
            auVar184._28_4_ = 0x3f800000;
            auVar115 = vsubps_avx(auVar184,auVar113);
            auVar115 = vblendvps_avx(auVar115,auVar113,auVar11);
            auVar217 = ZEXT3264(auVar115);
            auVar115 = vsubps_avx(auVar184,auVar137);
            local_3a0 = vblendvps_avx(auVar115,auVar137,auVar11);
            auVar202 = ZEXT3264(auVar105);
            auVar146 = ZEXT3264(auVar176);
          }
        }
        auVar226 = ZEXT3264(_local_6e0);
        local_640 = auVar217._0_32_;
        local_660 = auVar146._0_32_;
        auVar105 = auVar202._0_32_;
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0x7f,0) == '\0') &&
              (auVar202 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar105 >> 0xbf,0) == '\0') &&
            (auVar202 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar202[0x1f]) {
          auVar146 = ZEXT3264(local_780);
          auVar202 = ZEXT3264(CONCAT428(local_7a0,
                                        CONCAT424(local_7a0,
                                                  CONCAT420(local_7a0,
                                                            CONCAT416(local_7a0,
                                                                      CONCAT412(local_7a0,
                                                                                CONCAT48(local_7a0,
                                                                                         CONCAT44(
                                                  local_7a0,local_7a0))))))));
        }
        else {
          auVar115 = vsubps_avx(ZEXT1632(auVar16),auVar229);
          auVar13 = vfmadd213ps_fma(auVar115,local_640,auVar229);
          fVar148 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar38._4_4_ = (auVar13._4_4_ + auVar13._4_4_) * fVar148;
          auVar38._0_4_ = (auVar13._0_4_ + auVar13._0_4_) * fVar148;
          auVar38._8_4_ = (auVar13._8_4_ + auVar13._8_4_) * fVar148;
          auVar38._12_4_ = (auVar13._12_4_ + auVar13._12_4_) * fVar148;
          auVar38._16_4_ = fVar148 * 0.0;
          auVar38._20_4_ = fVar148 * 0.0;
          auVar38._24_4_ = fVar148 * 0.0;
          auVar38._28_4_ = 0;
          auVar115 = vcmpps_avx(local_660,auVar38,6);
          auVar176 = auVar105 & auVar115;
          auVar202 = ZEXT3264(CONCAT428(local_7a0,
                                        CONCAT424(local_7a0,
                                                  CONCAT420(local_7a0,
                                                            CONCAT416(local_7a0,
                                                                      CONCAT412(local_7a0,
                                                                                CONCAT48(local_7a0,
                                                                                         CONCAT44(
                                                  local_7a0,local_7a0))))))));
          auVar113 = local_660;
          auVar137 = local_640;
          if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar176 >> 0x7f,0) != '\0') ||
                (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar176 >> 0xbf,0) != '\0') ||
              (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar176[0x1f] < '\0') {
            local_440 = vandps_avx(auVar115,auVar105);
            auVar138._8_4_ = 0xbf800000;
            auVar138._0_8_ = 0xbf800000bf800000;
            auVar138._12_4_ = 0xbf800000;
            auVar138._16_4_ = 0xbf800000;
            auVar138._20_4_ = 0xbf800000;
            auVar138._24_4_ = 0xbf800000;
            auVar138._28_4_ = 0xbf800000;
            auVar164._8_4_ = 0x40000000;
            auVar164._0_8_ = 0x4000000040000000;
            auVar164._12_4_ = 0x40000000;
            auVar164._16_4_ = 0x40000000;
            auVar164._20_4_ = 0x40000000;
            auVar164._24_4_ = 0x40000000;
            auVar164._28_4_ = 0x40000000;
            auVar13 = vfmadd213ps_fma(local_3a0,auVar164,auVar138);
            auVar179 = ZEXT1664(auVar13);
            local_4e0 = ZEXT1632(auVar13);
            local_3a0 = local_4e0;
            auVar105 = local_3a0;
            local_4a0 = 0;
            local_490 = local_800;
            uStack_488 = uStack_7f8;
            local_480 = local_740._0_8_;
            uStack_478 = local_740._8_8_;
            local_470 = local_750._0_8_;
            uStack_468 = local_750._8_8_;
            local_460 = local_6f0;
            uStack_458 = uStack_6e8;
            local_3a0 = auVar105;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar148 = 1.0 / auVar108._0_4_;
              local_420[0] = fVar148 * (auVar217._0_4_ + 0.0);
              local_420[1] = fVar148 * (auVar217._4_4_ + 1.0);
              local_420[2] = fVar148 * (auVar217._8_4_ + 2.0);
              local_420[3] = fVar148 * (auVar217._12_4_ + 3.0);
              fStack_410 = fVar148 * (auVar217._16_4_ + 4.0);
              fStack_40c = fVar148 * (auVar217._20_4_ + 5.0);
              fStack_408 = fVar148 * (auVar217._24_4_ + 6.0);
              fStack_404 = auVar217._28_4_ + 7.0;
              local_3a0._0_8_ = auVar13._0_8_;
              local_3a0._8_8_ = auVar13._8_8_;
              local_400 = local_3a0._0_8_;
              uStack_3f8 = local_3a0._8_8_;
              uStack_3f0 = 0;
              uStack_3e8 = 0;
              local_3e0 = local_660;
              auVar139._8_4_ = 0x7f800000;
              auVar139._0_8_ = 0x7f8000007f800000;
              auVar139._12_4_ = 0x7f800000;
              auVar139._16_4_ = 0x7f800000;
              auVar139._20_4_ = 0x7f800000;
              auVar139._24_4_ = 0x7f800000;
              auVar139._28_4_ = 0x7f800000;
              auVar105 = vblendvps_avx(auVar139,local_660,local_440);
              auVar115 = vshufps_avx(auVar105,auVar105,0xb1);
              auVar115 = vminps_avx(auVar105,auVar115);
              auVar176 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar176);
              auVar176 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar176);
              auVar115 = vcmpps_avx(auVar105,auVar115,0);
              auVar176 = local_440 & auVar115;
              auVar105 = local_440;
              if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar176 >> 0x7f,0) != '\0') ||
                    (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar176 >> 0xbf,0) != '\0') ||
                  (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar176[0x1f] < '\0') {
                auVar105 = vandps_avx(auVar115,local_440);
              }
              uVar92 = vmovmskps_avx(auVar105);
              uVar95 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                uVar95 = uVar95 + 1;
              }
              uVar93 = (ulong)uVar95;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar148 = local_420[uVar93];
                uVar126 = *(undefined4 *)((long)&local_400 + uVar93 * 4);
                fVar121 = 1.0 - fVar148;
                fVar119 = fVar121 * fVar121 * -3.0;
                auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar121 * fVar121)),
                                          ZEXT416((uint)(fVar148 * fVar121)),ZEXT416(0xc0000000));
                auVar14 = vfmsub132ss_fma(ZEXT416((uint)(fVar148 * fVar121)),
                                          ZEXT416((uint)(fVar148 * fVar148)),ZEXT416(0x40000000));
                fVar121 = auVar13._0_4_ * 3.0;
                fVar122 = auVar14._0_4_ * 3.0;
                fVar123 = fVar148 * fVar148 * 3.0;
                auVar188._0_4_ = fVar123 * (float)local_6f0._0_4_;
                auVar188._4_4_ = fVar123 * (float)local_6f0._4_4_;
                auVar188._8_4_ = fVar123 * (float)uStack_6e8;
                auVar188._12_4_ = fVar123 * uStack_6e8._4_4_;
                auVar153._4_4_ = fVar122;
                auVar153._0_4_ = fVar122;
                auVar153._8_4_ = fVar122;
                auVar153._12_4_ = fVar122;
                auVar13 = vfmadd132ps_fma(auVar153,auVar188,local_750);
                auVar172._4_4_ = fVar121;
                auVar172._0_4_ = fVar121;
                auVar172._8_4_ = fVar121;
                auVar172._12_4_ = fVar121;
                auVar13 = vfmadd132ps_fma(auVar172,auVar13,local_740);
                auVar154._4_4_ = fVar119;
                auVar154._0_4_ = fVar119;
                auVar154._8_4_ = fVar119;
                auVar154._12_4_ = fVar119;
                auVar13 = vfmadd132ps_fma(auVar154,auVar13,auVar12);
                auVar179 = ZEXT464(*(uint *)(local_3e0 + uVar93 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3e0 + uVar93 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar13._0_4_;
                uVar203 = vextractps_avx(auVar13,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar203;
                uVar203 = vextractps_avx(auVar13,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar203;
                *(float *)(ray + k * 4 + 0x1e0) = fVar148;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar126;
                *(uint *)(ray + k * 4 + 0x220) = uVar8;
                *(uint *)(ray + k * 4 + 0x240) = uVar7;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_8c0 = CONCAT44(uVar7,uVar7);
                uStack_8b8._0_4_ = uVar7;
                uStack_8b8._4_4_ = uVar7;
                uStack_8b0._0_4_ = uVar7;
                uStack_8b0._4_4_ = uVar7;
                auVar89 = _local_8c0;
                uStack_8a8._0_4_ = uVar7;
                uStack_8a8._4_4_ = uVar7;
                auVar105 = _local_8c0;
                local_720._4_4_ = uVar8;
                local_720._0_4_ = uVar8;
                uStack_718._0_4_ = (float)uVar8;
                uStack_718._4_4_ = (float)uVar8;
                uStack_710._0_4_ = uVar8;
                uStack_710._4_4_ = uVar8;
                uStack_708._0_4_ = uVar8;
                uStack_708._4_4_ = uVar8;
                local_6a0 = ZEXT1632(local_740);
                local_560 = ZEXT1632(local_750);
                _local_6c0 = ZEXT1632(_local_6f0);
                local_620 = local_440;
                local_500 = local_640;
                local_4c0 = local_660;
                local_49c = iVar91;
                do {
                  uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_1a0 = local_420[uVar93];
                  uVar203 = *(undefined4 *)((long)&local_400 + uVar93 * 4);
                  local_180._4_4_ = uVar203;
                  local_180._0_4_ = uVar203;
                  local_180._8_4_ = uVar203;
                  local_180._12_4_ = uVar203;
                  local_180._16_4_ = uVar203;
                  local_180._20_4_ = uVar203;
                  local_180._24_4_ = uVar203;
                  local_180._28_4_ = uVar203;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar93 * 4);
                  fVar121 = 1.0 - local_1a0;
                  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar121 * fVar121)),
                                            ZEXT416((uint)(local_1a0 * fVar121)),ZEXT416(0xc0000000)
                                           );
                  auVar13 = vfmsub132ss_fma(ZEXT416((uint)(local_1a0 * fVar121)),
                                            ZEXT416((uint)(local_1a0 * local_1a0)),
                                            ZEXT416(0x40000000));
                  fVar148 = auVar13._0_4_ * 3.0;
                  fVar119 = local_1a0 * local_1a0 * 3.0;
                  auVar191._0_4_ = fVar119 * (float)local_6c0._0_4_;
                  auVar191._4_4_ = fVar119 * (float)local_6c0._4_4_;
                  auVar191._8_4_ = fVar119 * fStack_6b8;
                  auVar191._12_4_ = fVar119 * fStack_6b4;
                  auVar160._4_4_ = fVar148;
                  auVar160._0_4_ = fVar148;
                  auVar160._8_4_ = fVar148;
                  auVar160._12_4_ = fVar148;
                  auVar13 = vfmadd132ps_fma(auVar160,auVar191,local_560._0_16_);
                  fVar148 = auVar14._0_4_ * 3.0;
                  auVar183._4_4_ = fVar148;
                  auVar183._0_4_ = fVar148;
                  auVar183._8_4_ = fVar148;
                  auVar183._12_4_ = fVar148;
                  auVar13 = vfmadd132ps_fma(auVar183,auVar13,local_6a0._0_16_);
                  fVar148 = fVar121 * fVar121 * -3.0;
                  local_7f0.context = context->user;
                  auVar161._4_4_ = fVar148;
                  auVar161._0_4_ = fVar148;
                  auVar161._8_4_ = fVar148;
                  auVar161._12_4_ = fVar148;
                  auVar14 = vfmadd132ps_fma(auVar161,auVar13,auVar12);
                  local_200 = auVar14._0_4_;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  auVar13 = vmovshdup_avx(auVar14);
                  auVar175._0_8_ = auVar13._0_8_;
                  auVar175._8_8_ = auVar175._0_8_;
                  local_1e0._16_8_ = auVar175._0_8_;
                  local_1e0._0_16_ = auVar175;
                  local_1e0._24_8_ = auVar175._0_8_;
                  auVar179 = ZEXT3264(local_1e0);
                  auVar13 = vshufps_avx(auVar14,auVar14,0xaa);
                  auVar162._0_8_ = auVar13._0_8_;
                  auVar162._8_8_ = auVar162._0_8_;
                  auVar169._16_8_ = auVar162._0_8_;
                  auVar169._0_16_ = auVar162;
                  auVar169._24_8_ = auVar162._0_8_;
                  local_1c0 = auVar169;
                  fStack_19c = local_1a0;
                  fStack_198 = local_1a0;
                  fStack_194 = local_1a0;
                  fStack_190 = local_1a0;
                  fStack_18c = local_1a0;
                  fStack_188 = local_1a0;
                  fStack_184 = local_1a0;
                  local_160 = local_720;
                  uStack_158 = uStack_718;
                  uStack_150 = uStack_710;
                  uStack_148 = uStack_708;
                  uStack_8b0 = auVar89._16_8_;
                  uStack_8a8 = auVar105._24_8_;
                  local_140 = local_8c0;
                  uStack_138 = uStack_8b8;
                  uStack_130 = uStack_8b0;
                  uStack_128 = uStack_8a8;
                  auVar115 = vpcmpeqd_avx2(local_180,local_180);
                  local_728[1] = auVar115;
                  *local_728 = auVar115;
                  local_120 = (local_7f0.context)->instID[0];
                  uStack_11c = local_120;
                  uStack_118 = local_120;
                  uStack_114 = local_120;
                  uStack_110 = local_120;
                  uStack_10c = local_120;
                  uStack_108 = local_120;
                  uStack_104 = local_120;
                  local_100 = (local_7f0.context)->instPrimID[0];
                  uStack_fc = local_100;
                  uStack_f8 = local_100;
                  uStack_f4 = local_100;
                  uStack_f0 = local_100;
                  uStack_ec = local_100;
                  uStack_e8 = local_100;
                  uStack_e4 = local_100;
                  local_600 = local_280._0_8_;
                  uStack_5f8 = local_280._8_8_;
                  uStack_5f0 = local_280._16_8_;
                  uStack_5e8 = local_280._24_8_;
                  local_7f0.valid = (int *)&local_600;
                  local_7f0.geometryUserPtr = pGVar9->userPtr;
                  local_7f0.hit = (RTCHitN *)&local_200;
                  local_7f0.N = 8;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar169 = ZEXT1632(auVar162);
                    auVar179 = ZEXT1664(auVar175);
                    (*pGVar9->intersectionFilterN)(&local_7f0);
                    auVar117._8_56_ = extraout_var_00;
                    auVar117._0_8_ = extraout_XMM1_Qa_00;
                    auVar226 = ZEXT3264(_local_6e0);
                    auVar202 = ZEXT3264(CONCAT428(fStack_784,
                                                  CONCAT424(fStack_788,
                                                            CONCAT420(fStack_78c,
                                                                      CONCAT416(fStack_790,
                                                                                CONCAT412(fStack_794
                                                                                          ,CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
                    auVar146 = ZEXT3264(local_660);
                    auVar217 = ZEXT3264(local_640);
                    auVar115 = vpcmpeqd_avx2(auVar117._0_32_,auVar117._0_32_);
                  }
                  auVar85._8_8_ = uStack_5f8;
                  auVar85._0_8_ = local_600;
                  auVar85._16_8_ = uStack_5f0;
                  auVar85._24_8_ = uStack_5e8;
                  auVar113 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar85);
                  auVar176 = auVar115 & ~auVar113;
                  if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar176 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar176 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar176 >> 0x7f,0) == '\0') &&
                        (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar176 >> 0xbf,0) == '\0') &&
                      (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar176[0x1f]) {
                    auVar117 = ZEXT3264(auVar113 ^ auVar115);
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar169 = ZEXT1632(auVar169._0_16_);
                      auVar179 = ZEXT1664(auVar179._0_16_);
                      (*p_Var10)(&local_7f0);
                      auVar226 = ZEXT3264(_local_6e0);
                      auVar202 = ZEXT3264(CONCAT428(fStack_784,
                                                    CONCAT424(fStack_788,
                                                              CONCAT420(fStack_78c,
                                                                        CONCAT416(fStack_790,
                                                                                  CONCAT412(
                                                  fStack_794,
                                                  CONCAT48(fStack_798,CONCAT44(fStack_79c,local_7a0)
                                                          )))))));
                      auVar146 = ZEXT3264(local_660);
                      auVar217 = ZEXT3264(local_640);
                    }
                    auVar86._8_8_ = uStack_5f8;
                    auVar86._0_8_ = local_600;
                    auVar86._16_8_ = uStack_5f0;
                    auVar86._24_8_ = uStack_5e8;
                    auVar176 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar86);
                    auVar113 = vpcmpeqd_avx2(auVar169,auVar169);
                    auVar117 = ZEXT3264(auVar176 ^ auVar113);
                    auVar115 = auVar113 & ~auVar176;
                    if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar115 >> 0x7f,0) != '\0') ||
                          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar115 >> 0xbf,0) != '\0') ||
                        (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar115[0x1f] < '\0') {
                      auVar144._0_4_ = auVar176._0_4_ ^ auVar113._0_4_;
                      auVar144._4_4_ = auVar176._4_4_ ^ auVar113._4_4_;
                      auVar144._8_4_ = auVar176._8_4_ ^ auVar113._8_4_;
                      auVar144._12_4_ = auVar176._12_4_ ^ auVar113._12_4_;
                      auVar144._16_4_ = auVar176._16_4_ ^ auVar113._16_4_;
                      auVar144._20_4_ = auVar176._20_4_ ^ auVar113._20_4_;
                      auVar144._24_4_ = auVar176._24_4_ ^ auVar113._24_4_;
                      auVar144._28_4_ = auVar176._28_4_ ^ auVar113._28_4_;
                      auVar115 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])local_7f0.hit);
                      *(undefined1 (*) [32])(local_7f0.ray + 0x180) = auVar115;
                      auVar115 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x20));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x1a0) = auVar115;
                      auVar115 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x40));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x1c0) = auVar115;
                      auVar115 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x60));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x1e0) = auVar115;
                      auVar115 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x80));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x200) = auVar115;
                      auVar115 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x220) = auVar115;
                      auVar115 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x240) = auVar115;
                      auVar115 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x260) = auVar115;
                      auVar115 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0x100));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x280) = auVar115;
                    }
                  }
                  auVar113 = auVar146._0_32_;
                  auVar115 = auVar117._0_32_;
                  if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar115 >> 0x7f,0) == '\0') &&
                        (auVar117 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                       SUB321(auVar115 >> 0xbf,0) == '\0') &&
                      (auVar117 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                      -1 < auVar117[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar126;
                  }
                  *(undefined4 *)(local_620 + uVar93 * 4) = 0;
                  uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar116._4_4_ = uVar126;
                  auVar116._0_4_ = uVar126;
                  auVar116._8_4_ = uVar126;
                  auVar116._12_4_ = uVar126;
                  auVar116._16_4_ = uVar126;
                  auVar116._20_4_ = uVar126;
                  auVar116._24_4_ = uVar126;
                  auVar116._28_4_ = uVar126;
                  auVar176 = vcmpps_avx(auVar113,auVar116,2);
                  auVar115 = vandps_avx(auVar176,local_620);
                  local_620 = local_620 & auVar176;
                  bVar75 = (local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar76 = (local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar74 = (local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar73 = SUB321(local_620 >> 0x7f,0) != '\0';
                  bVar72 = (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar71 = SUB321(local_620 >> 0xbf,0) != '\0';
                  bVar69 = (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar68 = local_620[0x1f] < '\0';
                  if (((((((bVar75 || bVar76) || bVar74) || bVar73) || bVar72) || bVar71) || bVar69)
                      || bVar68) {
                    auVar145._8_4_ = 0x7f800000;
                    auVar145._0_8_ = 0x7f8000007f800000;
                    auVar145._12_4_ = 0x7f800000;
                    auVar145._16_4_ = 0x7f800000;
                    auVar145._20_4_ = 0x7f800000;
                    auVar145._24_4_ = 0x7f800000;
                    auVar145._28_4_ = 0x7f800000;
                    auVar176 = vblendvps_avx(auVar145,auVar113,auVar115);
                    auVar137 = vshufps_avx(auVar176,auVar176,0xb1);
                    auVar137 = vminps_avx(auVar176,auVar137);
                    auVar214 = vshufpd_avx(auVar137,auVar137,5);
                    auVar137 = vminps_avx(auVar137,auVar214);
                    auVar214 = vpermpd_avx2(auVar137,0x4e);
                    auVar179 = ZEXT3264(auVar214);
                    auVar137 = vminps_avx(auVar137,auVar214);
                    auVar137 = vcmpps_avx(auVar176,auVar137,0);
                    auVar214 = auVar115 & auVar137;
                    auVar176 = auVar115;
                    if ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar214 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar214 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar214 >> 0x7f,0) != '\0') ||
                          (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar214 >> 0xbf,0) != '\0') ||
                        (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar214[0x1f] < '\0') {
                      auVar176 = vandps_avx(auVar137,auVar115);
                    }
                    uVar92 = vmovmskps_avx(auVar176);
                    uVar95 = 0;
                    for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                      uVar95 = uVar95 + 1;
                    }
                    uVar93 = (ulong)uVar95;
                  }
                  local_620 = auVar115;
                  auVar137 = auVar217._0_32_;
                } while (((((((bVar75 || bVar76) || bVar74) || bVar73) || bVar72) || bVar71) ||
                         bVar69) || bVar68);
              }
            }
          }
          local_640 = auVar137;
          local_660 = auVar113;
          auVar146 = ZEXT3264(local_780);
        }
      }
      if (8 < iVar91) {
        _local_6e0 = auVar226._0_32_;
        local_300._4_4_ = iVar91;
        local_300._0_4_ = iVar91;
        local_300._8_4_ = iVar91;
        local_300._12_4_ = iVar91;
        local_300._16_4_ = iVar91;
        local_300._20_4_ = iVar91;
        local_300._24_4_ = iVar91;
        local_300._28_4_ = iVar91;
        local_340 = fVar149;
        fStack_33c = fVar149;
        fStack_338 = fVar149;
        fStack_334 = fVar149;
        fStack_330 = fVar149;
        fStack_32c = fVar149;
        fStack_328 = fVar149;
        fStack_324 = fVar149;
        local_360._4_4_ = local_7c0._0_4_;
        local_360._0_4_ = local_7c0._0_4_;
        local_360._8_4_ = local_7c0._0_4_;
        local_360._12_4_ = local_7c0._0_4_;
        local_360._16_4_ = local_7c0._0_4_;
        local_360._20_4_ = local_7c0._0_4_;
        local_360._24_4_ = local_7c0._0_4_;
        local_360._28_4_ = local_7c0._0_4_;
        fStack_510 = 1.0 / local_520;
        auStack_51c._0_4_ = fStack_510;
        local_520 = fStack_510;
        auStack_51c._4_4_ = fStack_510;
        fStack_514 = fStack_510;
        local_380._4_4_ = uVar7;
        local_380._0_4_ = uVar7;
        local_380._8_4_ = uVar7;
        local_380._12_4_ = uVar7;
        local_380._16_4_ = uVar7;
        local_380._20_4_ = uVar7;
        local_380._24_4_ = uVar7;
        local_380._28_4_ = uVar7;
        local_e0 = uVar8;
        uStack_dc = uVar8;
        uStack_d8 = uVar8;
        uStack_d4 = uVar8;
        uStack_d0 = uVar8;
        uStack_cc = uVar8;
        uStack_c8 = uVar8;
        uStack_c4 = uVar8;
        lVar94 = 8;
        fStack_50c = fStack_510;
        fStack_508 = fStack_510;
        fStack_504 = fStack_510;
        do {
          auVar17 = local_740;
          auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar94 * 4 + lVar19);
          auVar115 = *(undefined1 (*) [32])(lVar19 + 0x2227768 + lVar94 * 4);
          auVar176 = *(undefined1 (*) [32])(lVar19 + 0x2227bec + lVar94 * 4);
          pauVar1 = (undefined1 (*) [32])(lVar19 + 0x2228070 + lVar94 * 4);
          fVar125 = *(float *)*pauVar1;
          fVar222 = *(float *)(*pauVar1 + 4);
          fVar228 = *(float *)(*pauVar1 + 8);
          fVar234 = *(float *)(*pauVar1 + 0xc);
          fVar235 = *(float *)(*pauVar1 + 0x10);
          fVar236 = *(float *)(*pauVar1 + 0x14);
          fVar237 = *(float *)(*pauVar1 + 0x18);
          auVar88 = *(undefined1 (*) [28])*pauVar1;
          auVar227._0_4_ = auVar202._0_4_ * fVar125;
          auVar227._4_4_ = auVar202._4_4_ * fVar222;
          auVar227._8_4_ = auVar202._8_4_ * fVar228;
          auVar227._12_4_ = auVar202._12_4_ * fVar234;
          auVar227._16_4_ = auVar202._16_4_ * fVar235;
          auVar227._20_4_ = auVar202._20_4_ * fVar236;
          auVar227._28_36_ = auVar226._28_36_;
          auVar227._24_4_ = auVar202._24_4_ * fVar237;
          auVar226._0_4_ = fVar118 * fVar125;
          auVar226._4_4_ = fVar120 * fVar222;
          auVar226._8_4_ = fVar118 * fVar228;
          auVar226._12_4_ = fVar120 * fVar234;
          auVar226._16_4_ = fVar118 * fVar235;
          auVar226._20_4_ = fVar120 * fVar236;
          auVar226._28_36_ = auVar179._28_36_;
          auVar226._24_4_ = fVar118 * fVar237;
          auVar13 = vfmadd231ps_fma(auVar227._0_32_,auVar176,auVar131);
          auVar14 = vfmadd231ps_fma(auVar226._0_32_,auVar176,auVar146._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar115,auVar197);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar115,local_540);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar105,auVar192);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar105,local_5a0);
          auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar94 * 4 + lVar19);
          auVar137 = *(undefined1 (*) [32])(lVar19 + 0x2229b88 + lVar94 * 4);
          auVar214 = *(undefined1 (*) [32])(lVar19 + 0x222a00c + lVar94 * 4);
          pfVar2 = (float *)(lVar19 + 0x222a490 + lVar94 * 4);
          fVar238 = *pfVar2;
          fVar77 = pfVar2[1];
          fVar78 = pfVar2[2];
          fVar79 = pfVar2[3];
          fVar80 = pfVar2[4];
          fVar81 = pfVar2[5];
          fVar82 = pfVar2[6];
          auVar217._0_4_ = fVar238 * auVar202._0_4_;
          auVar217._4_4_ = fVar77 * auVar202._4_4_;
          auVar217._8_4_ = fVar78 * auVar202._8_4_;
          auVar217._12_4_ = fVar79 * auVar202._12_4_;
          auVar217._16_4_ = fVar80 * auVar202._16_4_;
          auVar217._20_4_ = fVar81 * auVar202._20_4_;
          auVar217._28_36_ = auVar202._28_36_;
          auVar217._24_4_ = fVar82 * auVar202._24_4_;
          auVar39._4_4_ = fVar77 * fVar120;
          auVar39._0_4_ = fVar238 * fVar118;
          auVar39._8_4_ = fVar78 * fVar118;
          auVar39._12_4_ = fVar79 * fVar120;
          auVar39._16_4_ = fVar80 * fVar118;
          auVar39._20_4_ = fVar81 * fVar120;
          auVar39._24_4_ = fVar82 * fVar118;
          auVar39._28_4_ = fVar120;
          auVar15 = vfmadd231ps_fma(auVar217._0_32_,auVar214,auVar131);
          auVar16 = vfmadd231ps_fma(auVar39,auVar214,auVar146._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar137,auVar197);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar137,local_540);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar113,auVar192);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar113,local_5a0);
          local_6a0 = ZEXT1632(auVar13);
          _local_6c0 = vsubps_avx(ZEXT1632(auVar15),local_6a0);
          local_7c0 = ZEXT1632(auVar16);
          auVar106 = ZEXT1632(auVar14);
          local_560 = vsubps_avx(local_7c0,auVar106);
          auVar70._4_4_ = auVar14._4_4_ * local_6c0._4_4_;
          auVar70._0_4_ = auVar14._0_4_ * local_6c0._0_4_;
          auVar70._8_4_ = auVar14._8_4_ * local_6c0._8_4_;
          auVar70._12_4_ = auVar14._12_4_ * local_6c0._12_4_;
          auVar70._16_4_ = local_6c0._16_4_ * 0.0;
          auVar70._20_4_ = local_6c0._20_4_ * 0.0;
          auVar70._24_4_ = local_6c0._24_4_ * 0.0;
          auVar70._28_4_ = local_5a0._28_4_;
          fVar149 = local_560._0_4_;
          auVar179._0_4_ = auVar13._0_4_ * fVar149;
          fVar148 = local_560._4_4_;
          auVar179._4_4_ = auVar13._4_4_ * fVar148;
          fVar119 = local_560._8_4_;
          auVar179._8_4_ = auVar13._8_4_ * fVar119;
          fVar121 = local_560._12_4_;
          auVar179._12_4_ = auVar13._12_4_ * fVar121;
          fVar122 = local_560._16_4_;
          auVar179._16_4_ = fVar122 * 0.0;
          fVar123 = local_560._20_4_;
          auVar179._20_4_ = fVar123 * 0.0;
          fVar124 = local_560._24_4_;
          auVar179._28_36_ = auVar146._28_36_;
          auVar179._24_4_ = fVar124 * 0.0;
          auVar226 = ZEXT3264(auVar176);
          auVar107 = vsubps_avx(auVar70,auVar179._0_32_);
          _local_2e0 = *pauVar1;
          auVar11 = _local_2e0;
          auVar165._0_4_ = (float)local_240._0_4_ * fVar125;
          auVar165._4_4_ = (float)local_240._4_4_ * fVar222;
          auVar165._8_4_ = fStack_238 * fVar228;
          auVar165._12_4_ = fStack_234 * fVar234;
          auVar165._16_4_ = fStack_230 * fVar235;
          auVar165._20_4_ = fStack_22c * fVar236;
          auVar165._24_4_ = fStack_228 * fVar237;
          auVar165._28_4_ = 0;
          auVar13 = vfmadd231ps_fma(auVar165,auVar176,local_a0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_80,auVar115);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_220,auVar105);
          auVar40._4_4_ = fVar77 * (float)local_240._4_4_;
          auVar40._0_4_ = fVar238 * (float)local_240._0_4_;
          auVar40._8_4_ = fVar78 * fStack_238;
          auVar40._12_4_ = fVar79 * fStack_234;
          auVar40._16_4_ = fVar80 * fStack_230;
          auVar40._20_4_ = fVar81 * fStack_22c;
          auVar40._24_4_ = fVar82 * fStack_228;
          auVar40._28_4_ = uStack_224;
          auVar14 = vfmadd231ps_fma(auVar40,auVar214,local_a0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar137,local_80);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar113,local_220);
          auVar41._4_4_ = fVar148 * fVar148;
          auVar41._0_4_ = fVar149 * fVar149;
          auVar41._8_4_ = fVar119 * fVar119;
          auVar41._12_4_ = fVar121 * fVar121;
          auVar41._16_4_ = fVar122 * fVar122;
          auVar41._20_4_ = fVar123 * fVar123;
          auVar41._24_4_ = fVar124 * fVar124;
          auVar41._28_4_ = local_220._28_4_;
          auVar16 = vfmadd231ps_fma(auVar41,_local_6c0,_local_6c0);
          auVar140 = ZEXT1632(auVar14);
          auVar210 = vmaxps_avx(ZEXT1632(auVar13),auVar140);
          auVar211._0_4_ = auVar210._0_4_ * auVar210._0_4_ * auVar16._0_4_;
          auVar211._4_4_ = auVar210._4_4_ * auVar210._4_4_ * auVar16._4_4_;
          auVar211._8_4_ = auVar210._8_4_ * auVar210._8_4_ * auVar16._8_4_;
          auVar211._12_4_ = auVar210._12_4_ * auVar210._12_4_ * auVar16._12_4_;
          auVar211._16_4_ = auVar210._16_4_ * auVar210._16_4_ * 0.0;
          auVar211._20_4_ = auVar210._20_4_ * auVar210._20_4_ * 0.0;
          auVar211._24_4_ = auVar210._24_4_ * auVar210._24_4_ * 0.0;
          auVar211._28_4_ = 0;
          auVar42._4_4_ = auVar107._4_4_ * auVar107._4_4_;
          auVar42._0_4_ = auVar107._0_4_ * auVar107._0_4_;
          auVar42._8_4_ = auVar107._8_4_ * auVar107._8_4_;
          auVar42._12_4_ = auVar107._12_4_ * auVar107._12_4_;
          auVar42._16_4_ = auVar107._16_4_ * auVar107._16_4_;
          auVar42._20_4_ = auVar107._20_4_ * auVar107._20_4_;
          auVar42._24_4_ = auVar107._24_4_ * auVar107._24_4_;
          auVar42._28_4_ = auVar107._28_4_;
          auVar210 = vcmpps_avx(auVar42,auVar211,2);
          auVar179 = ZEXT3264(auVar210);
          local_4a0 = (int)lVar94;
          auVar212._4_4_ = local_4a0;
          auVar212._0_4_ = local_4a0;
          auVar212._8_4_ = local_4a0;
          auVar212._12_4_ = local_4a0;
          auVar212._16_4_ = local_4a0;
          auVar212._20_4_ = local_4a0;
          auVar212._24_4_ = local_4a0;
          auVar212._28_4_ = local_4a0;
          auVar107 = vpor_avx2(auVar212,_DAT_0205a920);
          auVar18 = vpcmpgtd_avx2(local_300,auVar107);
          auVar107 = auVar18 & auVar210;
          if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar107 >> 0x7f,0) == '\0') &&
                (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0xbf,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar107[0x1f]) {
LAB_016a268d:
            auVar202 = ZEXT3264(CONCAT428(fStack_784,
                                          CONCAT424(fStack_788,
                                                    CONCAT420(fStack_78c,
                                                              CONCAT416(fStack_790,
                                                                        CONCAT412(fStack_794,
                                                                                  CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
          }
          else {
            local_320 = vandps_avx(auVar18,auVar210);
            auVar43._4_4_ = (float)local_6e0._4_4_ * fVar77;
            auVar43._0_4_ = (float)local_6e0._0_4_ * fVar238;
            auVar43._8_4_ = fStack_6d8 * fVar78;
            auVar43._12_4_ = fStack_6d4 * fVar79;
            auVar43._16_4_ = fStack_6d0 * fVar80;
            auVar43._20_4_ = fStack_6cc * fVar81;
            auVar43._24_4_ = fStack_6c8 * fVar82;
            auVar43._28_4_ = auVar210._28_4_;
            auVar14 = vfmadd213ps_fma(auVar214,local_2c0,auVar43);
            auVar14 = vfmadd213ps_fma(auVar137,local_260,ZEXT1632(auVar14));
            auVar14 = vfmadd132ps_fma(auVar113,ZEXT1632(auVar14),local_680);
            local_2e0._0_4_ = auVar88._0_4_;
            local_2e0._4_4_ = auVar88._4_4_;
            fStack_2d8 = auVar88._8_4_;
            fStack_2d4 = auVar88._12_4_;
            fStack_2d0 = auVar88._16_4_;
            fStack_2cc = auVar88._20_4_;
            fStack_2c8 = auVar88._24_4_;
            auVar44._4_4_ = (float)local_6e0._4_4_ * (float)local_2e0._4_4_;
            auVar44._0_4_ = (float)local_6e0._0_4_ * (float)local_2e0._0_4_;
            auVar44._8_4_ = fStack_6d8 * fStack_2d8;
            auVar44._12_4_ = fStack_6d4 * fStack_2d4;
            auVar44._16_4_ = fStack_6d0 * fStack_2d0;
            auVar44._20_4_ = fStack_6cc * fStack_2cc;
            auVar44._24_4_ = fStack_6c8 * fStack_2c8;
            auVar44._28_4_ = auVar210._28_4_;
            auVar16 = vfmadd213ps_fma(auVar176,local_2c0,auVar44);
            auVar16 = vfmadd213ps_fma(auVar115,local_260,ZEXT1632(auVar16));
            auVar115 = *(undefined1 (*) [32])(lVar19 + 0x22284f4 + lVar94 * 4);
            auVar176 = *(undefined1 (*) [32])(lVar19 + 0x2228978 + lVar94 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar19 + 0x2228dfc + lVar94 * 4);
            pfVar3 = (float *)(lVar19 + 0x2229280 + lVar94 * 4);
            fVar149 = *pfVar3;
            fVar148 = pfVar3[1];
            fVar119 = pfVar3[2];
            fVar121 = pfVar3[3];
            fVar122 = pfVar3[4];
            fVar123 = pfVar3[5];
            fVar124 = pfVar3[6];
            auVar45._4_4_ = fVar148 * fStack_79c;
            auVar45._0_4_ = fVar149 * local_7a0;
            auVar45._8_4_ = fVar119 * fStack_798;
            auVar45._12_4_ = fVar121 * fStack_794;
            auVar45._16_4_ = fVar122 * fStack_790;
            auVar45._20_4_ = fVar123 * fStack_78c;
            auVar45._24_4_ = fVar124 * fStack_788;
            auVar45._28_4_ = pfVar2[7];
            auVar224._0_4_ = fVar118 * fVar149;
            auVar224._4_4_ = fVar120 * fVar148;
            auVar224._8_4_ = fVar118 * fVar119;
            auVar224._12_4_ = fVar120 * fVar121;
            auVar224._16_4_ = fVar118 * fVar122;
            auVar224._20_4_ = fVar120 * fVar123;
            auVar224._24_4_ = fVar118 * fVar124;
            auVar224._28_4_ = 0;
            auVar46._4_4_ = fVar148 * (float)local_6e0._4_4_;
            auVar46._0_4_ = fVar149 * (float)local_6e0._0_4_;
            auVar46._8_4_ = fVar119 * fStack_6d8;
            auVar46._12_4_ = fVar121 * fStack_6d4;
            auVar46._16_4_ = fVar122 * fStack_6d0;
            auVar46._20_4_ = fVar123 * fStack_6cc;
            auVar46._24_4_ = fVar124 * fStack_6c8;
            auVar46._28_4_ = pfVar3[7];
            auVar102 = vfmadd231ps_fma(auVar45,auVar113,auVar131);
            auVar101 = vfmadd231ps_fma(auVar224,auVar113,local_780);
            auVar150 = vfmadd231ps_fma(auVar46,local_2c0,auVar113);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar176,auVar197);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar176,local_540);
            auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),local_260,auVar176);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar115,auVar192);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar115,local_5a0);
            auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar115,local_680);
            pfVar2 = (float *)(lVar19 + 0x222b6a0 + lVar94 * 4);
            fVar149 = *pfVar2;
            fVar148 = pfVar2[1];
            fVar119 = pfVar2[2];
            fVar121 = pfVar2[3];
            fVar122 = pfVar2[4];
            fVar123 = pfVar2[5];
            fVar124 = pfVar2[6];
            auVar47._4_4_ = fStack_79c * fVar148;
            auVar47._0_4_ = local_7a0 * fVar149;
            auVar47._8_4_ = fStack_798 * fVar119;
            auVar47._12_4_ = fStack_794 * fVar121;
            auVar47._16_4_ = fStack_790 * fVar122;
            auVar47._20_4_ = fStack_78c * fVar123;
            auVar47._24_4_ = fStack_788 * fVar124;
            auVar47._28_4_ = local_260._28_4_;
            auVar48._4_4_ = fVar120 * fVar148;
            auVar48._0_4_ = fVar118 * fVar149;
            auVar48._8_4_ = fVar118 * fVar119;
            auVar48._12_4_ = fVar120 * fVar121;
            auVar48._16_4_ = fVar118 * fVar122;
            auVar48._20_4_ = fVar120 * fVar123;
            auVar48._24_4_ = fVar118 * fVar124;
            auVar48._28_4_ = fVar120;
            auVar49._4_4_ = fVar148 * (float)local_6e0._4_4_;
            auVar49._0_4_ = fVar149 * (float)local_6e0._0_4_;
            auVar49._8_4_ = fVar119 * fStack_6d8;
            auVar49._12_4_ = fVar121 * fStack_6d4;
            auVar49._16_4_ = fVar122 * fStack_6d0;
            auVar49._20_4_ = fVar123 * fStack_6cc;
            auVar49._24_4_ = fVar124 * fStack_6c8;
            auVar49._28_4_ = pfVar2[7];
            auVar115 = *(undefined1 (*) [32])(lVar19 + 0x222b21c + lVar94 * 4);
            auVar128 = vfmadd231ps_fma(auVar47,auVar115,auVar131);
            auVar100 = vfmadd231ps_fma(auVar48,auVar115,local_780);
            auVar129 = vfmadd231ps_fma(auVar49,local_2c0,auVar115);
            auVar115 = *(undefined1 (*) [32])(lVar19 + 0x222ad98 + lVar94 * 4);
            auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar115,auVar197);
            auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar115,local_540);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar115,local_260);
            auVar115 = *(undefined1 (*) [32])(lVar19 + 0x222a914 + lVar94 * 4);
            auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar115,auVar192);
            auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar115,local_5a0);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),local_680,auVar115);
            auVar213._8_4_ = 0x7fffffff;
            auVar213._0_8_ = 0x7fffffff7fffffff;
            auVar213._12_4_ = 0x7fffffff;
            auVar213._16_4_ = 0x7fffffff;
            auVar213._20_4_ = 0x7fffffff;
            auVar213._24_4_ = 0x7fffffff;
            auVar213._28_4_ = 0x7fffffff;
            auVar115 = vandps_avx(ZEXT1632(auVar102),auVar213);
            auVar176 = vandps_avx(ZEXT1632(auVar101),auVar213);
            auVar176 = vmaxps_avx(auVar115,auVar176);
            auVar115 = vandps_avx(ZEXT1632(auVar150),auVar213);
            auVar115 = vmaxps_avx(auVar176,auVar115);
            auVar87._4_4_ = fStack_33c;
            auVar87._0_4_ = local_340;
            auVar87._8_4_ = fStack_338;
            auVar87._12_4_ = fStack_334;
            auVar87._16_4_ = fStack_330;
            auVar87._20_4_ = fStack_32c;
            auVar87._24_4_ = fStack_328;
            auVar87._28_4_ = fStack_324;
            auVar115 = vcmpps_avx(auVar115,auVar87,1);
            auVar113 = vblendvps_avx(ZEXT1632(auVar102),_local_6c0,auVar115);
            auVar137 = vblendvps_avx(ZEXT1632(auVar101),local_560,auVar115);
            auVar115 = vandps_avx(ZEXT1632(auVar128),auVar213);
            auVar176 = vandps_avx(ZEXT1632(auVar100),auVar213);
            auVar176 = vmaxps_avx(auVar115,auVar176);
            auVar115 = vandps_avx(auVar213,ZEXT1632(auVar129));
            auVar115 = vmaxps_avx(auVar176,auVar115);
            auVar176 = vcmpps_avx(auVar115,auVar87,1);
            auVar115 = vblendvps_avx(ZEXT1632(auVar128),_local_6c0,auVar176);
            auVar176 = vblendvps_avx(ZEXT1632(auVar100),local_560,auVar176);
            auVar16 = vfmadd213ps_fma(auVar105,local_680,ZEXT1632(auVar16));
            auVar102 = vfmadd213ps_fma(auVar113,auVar113,ZEXT832(0) << 0x20);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar137,auVar137);
            auVar105 = vrsqrtps_avx(ZEXT1632(auVar102));
            fVar149 = auVar105._0_4_;
            fVar148 = auVar105._4_4_;
            fVar119 = auVar105._8_4_;
            fVar121 = auVar105._12_4_;
            fVar122 = auVar105._16_4_;
            fVar123 = auVar105._20_4_;
            fVar124 = auVar105._24_4_;
            auVar50._4_4_ = fVar148 * fVar148 * fVar148 * auVar102._4_4_ * -0.5;
            auVar50._0_4_ = fVar149 * fVar149 * fVar149 * auVar102._0_4_ * -0.5;
            auVar50._8_4_ = fVar119 * fVar119 * fVar119 * auVar102._8_4_ * -0.5;
            auVar50._12_4_ = fVar121 * fVar121 * fVar121 * auVar102._12_4_ * -0.5;
            auVar50._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar50._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar50._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
            auVar50._28_4_ = 0;
            auVar233._8_4_ = 0x3fc00000;
            auVar233._0_8_ = 0x3fc000003fc00000;
            auVar233._12_4_ = 0x3fc00000;
            auVar233._16_4_ = 0x3fc00000;
            auVar233._20_4_ = 0x3fc00000;
            auVar233._24_4_ = 0x3fc00000;
            auVar233._28_4_ = 0x3fc00000;
            auVar102 = vfmadd231ps_fma(auVar50,auVar233,auVar105);
            fVar149 = auVar102._0_4_;
            fVar148 = auVar102._4_4_;
            auVar51._4_4_ = auVar137._4_4_ * fVar148;
            auVar51._0_4_ = auVar137._0_4_ * fVar149;
            fVar119 = auVar102._8_4_;
            auVar51._8_4_ = auVar137._8_4_ * fVar119;
            fVar121 = auVar102._12_4_;
            auVar51._12_4_ = auVar137._12_4_ * fVar121;
            auVar51._16_4_ = auVar137._16_4_ * 0.0;
            auVar51._20_4_ = auVar137._20_4_ * 0.0;
            auVar51._24_4_ = auVar137._24_4_ * 0.0;
            auVar51._28_4_ = auVar105._28_4_;
            auVar52._4_4_ = fVar148 * -auVar113._4_4_;
            auVar52._0_4_ = fVar149 * -auVar113._0_4_;
            auVar52._8_4_ = fVar119 * -auVar113._8_4_;
            auVar52._12_4_ = fVar121 * -auVar113._12_4_;
            auVar52._16_4_ = -auVar113._16_4_ * 0.0;
            auVar52._20_4_ = -auVar113._20_4_ * 0.0;
            auVar52._24_4_ = -auVar113._24_4_ * 0.0;
            auVar52._28_4_ = auVar137._28_4_;
            auVar102 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar176,auVar176);
            auVar105 = vrsqrtps_avx(ZEXT1632(auVar102));
            auVar53._28_4_ = local_540._28_4_;
            auVar53._0_28_ =
                 ZEXT1628(CONCAT412(fVar121 * 0.0,
                                    CONCAT48(fVar119 * 0.0,CONCAT44(fVar148 * 0.0,fVar149 * 0.0))));
            fVar149 = auVar105._0_4_;
            fVar148 = auVar105._4_4_;
            fVar119 = auVar105._8_4_;
            fVar121 = auVar105._12_4_;
            fVar122 = auVar105._16_4_;
            fVar123 = auVar105._20_4_;
            fVar124 = auVar105._24_4_;
            auVar54._4_4_ = fVar148 * fVar148 * fVar148 * auVar102._4_4_ * -0.5;
            auVar54._0_4_ = fVar149 * fVar149 * fVar149 * auVar102._0_4_ * -0.5;
            auVar54._8_4_ = fVar119 * fVar119 * fVar119 * auVar102._8_4_ * -0.5;
            auVar54._12_4_ = fVar121 * fVar121 * fVar121 * auVar102._12_4_ * -0.5;
            auVar54._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar54._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar54._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
            auVar54._28_4_ = 0;
            auVar102 = vfmadd231ps_fma(auVar54,auVar233,auVar105);
            fVar149 = auVar102._0_4_;
            fVar148 = auVar102._4_4_;
            auVar55._4_4_ = auVar176._4_4_ * fVar148;
            auVar55._0_4_ = auVar176._0_4_ * fVar149;
            fVar119 = auVar102._8_4_;
            auVar55._8_4_ = auVar176._8_4_ * fVar119;
            fVar121 = auVar102._12_4_;
            auVar55._12_4_ = auVar176._12_4_ * fVar121;
            auVar55._16_4_ = auVar176._16_4_ * 0.0;
            auVar55._20_4_ = auVar176._20_4_ * 0.0;
            auVar55._24_4_ = auVar176._24_4_ * 0.0;
            auVar55._28_4_ = 0;
            auVar56._4_4_ = fVar148 * -auVar115._4_4_;
            auVar56._0_4_ = fVar149 * -auVar115._0_4_;
            auVar56._8_4_ = fVar119 * -auVar115._8_4_;
            auVar56._12_4_ = fVar121 * -auVar115._12_4_;
            auVar56._16_4_ = -auVar115._16_4_ * 0.0;
            auVar56._20_4_ = -auVar115._20_4_ * 0.0;
            auVar56._24_4_ = -auVar115._24_4_ * 0.0;
            auVar56._28_4_ = auVar105._28_4_;
            auVar57._28_4_ = 0xbf000000;
            auVar57._0_28_ =
                 ZEXT1628(CONCAT412(fVar121 * 0.0,
                                    CONCAT48(fVar119 * 0.0,CONCAT44(fVar148 * 0.0,fVar149 * 0.0))));
            auVar102 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar13),local_6a0);
            auVar105 = ZEXT1632(auVar13);
            auVar101 = vfmadd213ps_fma(auVar52,auVar105,auVar106);
            auVar150 = vfmadd213ps_fma(auVar53,auVar105,ZEXT1632(auVar16));
            auVar129 = vfnmadd213ps_fma(auVar51,auVar105,local_6a0);
            auVar128 = vfmadd213ps_fma(auVar55,auVar140,ZEXT1632(auVar15));
            auVar170 = vfnmadd213ps_fma(auVar52,auVar105,auVar106);
            auVar100 = vfmadd213ps_fma(auVar56,auVar140,local_7c0);
            auVar166 = ZEXT1632(auVar13);
            auVar127 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar166,auVar53);
            auVar16 = vfmadd213ps_fma(auVar57,auVar140,ZEXT1632(auVar14));
            auVar181 = vfnmadd213ps_fma(auVar55,auVar140,ZEXT1632(auVar15));
            auVar99 = vfnmadd213ps_fma(auVar56,auVar140,local_7c0);
            auVar180 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar140,auVar57);
            auVar105 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar170));
            auVar115 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar127));
            auVar58._4_4_ = auVar105._4_4_ * auVar127._4_4_;
            auVar58._0_4_ = auVar105._0_4_ * auVar127._0_4_;
            auVar58._8_4_ = auVar105._8_4_ * auVar127._8_4_;
            auVar58._12_4_ = auVar105._12_4_ * auVar127._12_4_;
            auVar58._16_4_ = auVar105._16_4_ * 0.0;
            auVar58._20_4_ = auVar105._20_4_ * 0.0;
            auVar58._24_4_ = auVar105._24_4_ * 0.0;
            auVar58._28_4_ = local_540._28_4_;
            auVar15 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar170),auVar115);
            auVar59._4_4_ = auVar129._4_4_ * auVar115._4_4_;
            auVar59._0_4_ = auVar129._0_4_ * auVar115._0_4_;
            auVar59._8_4_ = auVar129._8_4_ * auVar115._8_4_;
            auVar59._12_4_ = auVar129._12_4_ * auVar115._12_4_;
            auVar59._16_4_ = auVar115._16_4_ * 0.0;
            auVar59._20_4_ = auVar115._20_4_ * 0.0;
            auVar59._24_4_ = auVar115._24_4_ * 0.0;
            auVar59._28_4_ = auVar115._28_4_;
            auVar214 = ZEXT1632(auVar129);
            auVar115 = vsubps_avx(ZEXT1632(auVar128),auVar214);
            auVar107 = ZEXT1632(auVar127);
            auVar14 = vfmsub231ps_fma(auVar59,auVar107,auVar115);
            auVar60._4_4_ = auVar170._4_4_ * auVar115._4_4_;
            auVar60._0_4_ = auVar170._0_4_ * auVar115._0_4_;
            auVar60._8_4_ = auVar170._8_4_ * auVar115._8_4_;
            auVar60._12_4_ = auVar170._12_4_ * auVar115._12_4_;
            auVar60._16_4_ = auVar115._16_4_ * 0.0;
            auVar60._20_4_ = auVar115._20_4_ * 0.0;
            auVar60._24_4_ = auVar115._24_4_ * 0.0;
            auVar60._28_4_ = auVar115._28_4_;
            auVar129 = vfmsub231ps_fma(auVar60,auVar214,auVar105);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar129),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar18 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
            auVar105 = vblendvps_avx(ZEXT1632(auVar181),ZEXT1632(auVar102),auVar18);
            auVar115 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar101),auVar18);
            local_7c0 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar150),auVar18);
            auVar176 = vblendvps_avx(auVar214,ZEXT1632(auVar128),auVar18);
            auVar113 = vblendvps_avx(ZEXT1632(auVar170),ZEXT1632(auVar100),auVar18);
            auVar137 = vblendvps_avx(auVar107,ZEXT1632(auVar16),auVar18);
            auVar214 = vblendvps_avx(ZEXT1632(auVar128),auVar214,auVar18);
            auVar210 = vblendvps_avx(ZEXT1632(auVar100),ZEXT1632(auVar170),auVar18);
            auVar14 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
            auVar107 = vblendvps_avx(ZEXT1632(auVar16),auVar107,auVar18);
            auVar214 = vsubps_avx(auVar214,auVar105);
            auVar210 = vsubps_avx(auVar210,auVar115);
            auVar106 = vsubps_avx(auVar107,local_7c0);
            auVar226 = ZEXT3264(auVar106);
            auVar108 = vsubps_avx(auVar105,auVar176);
            auVar132 = vsubps_avx(auVar115,auVar113);
            auVar133 = vsubps_avx(local_7c0,auVar137);
            auVar194._0_4_ = auVar106._0_4_ * auVar105._0_4_;
            auVar194._4_4_ = auVar106._4_4_ * auVar105._4_4_;
            auVar194._8_4_ = auVar106._8_4_ * auVar105._8_4_;
            auVar194._12_4_ = auVar106._12_4_ * auVar105._12_4_;
            auVar194._16_4_ = auVar106._16_4_ * auVar105._16_4_;
            auVar194._20_4_ = auVar106._20_4_ * auVar105._20_4_;
            auVar194._24_4_ = auVar106._24_4_ * auVar105._24_4_;
            auVar194._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar194,local_7c0,auVar214);
            auVar61._4_4_ = auVar214._4_4_ * auVar115._4_4_;
            auVar61._0_4_ = auVar214._0_4_ * auVar115._0_4_;
            auVar61._8_4_ = auVar214._8_4_ * auVar115._8_4_;
            auVar61._12_4_ = auVar214._12_4_ * auVar115._12_4_;
            auVar61._16_4_ = auVar214._16_4_ * auVar115._16_4_;
            auVar61._20_4_ = auVar214._20_4_ * auVar115._20_4_;
            auVar61._24_4_ = auVar214._24_4_ * auVar115._24_4_;
            auVar61._28_4_ = auVar107._28_4_;
            auVar16 = vfmsub231ps_fma(auVar61,auVar105,auVar210);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar15),_DAT_02020f00);
            auVar195._0_4_ = auVar210._0_4_ * local_7c0._0_4_;
            auVar195._4_4_ = auVar210._4_4_ * local_7c0._4_4_;
            auVar195._8_4_ = auVar210._8_4_ * local_7c0._8_4_;
            auVar195._12_4_ = auVar210._12_4_ * local_7c0._12_4_;
            auVar195._16_4_ = auVar210._16_4_ * local_7c0._16_4_;
            auVar195._20_4_ = auVar210._20_4_ * local_7c0._20_4_;
            auVar195._24_4_ = auVar210._24_4_ * local_7c0._24_4_;
            auVar195._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar195,auVar115,auVar106);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar196._0_4_ = auVar133._0_4_ * auVar176._0_4_;
            auVar196._4_4_ = auVar133._4_4_ * auVar176._4_4_;
            auVar196._8_4_ = auVar133._8_4_ * auVar176._8_4_;
            auVar196._12_4_ = auVar133._12_4_ * auVar176._12_4_;
            auVar196._16_4_ = auVar133._16_4_ * auVar176._16_4_;
            auVar196._20_4_ = auVar133._20_4_ * auVar176._20_4_;
            auVar196._24_4_ = auVar133._24_4_ * auVar176._24_4_;
            auVar196._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar196,auVar108,auVar137);
            auVar62._4_4_ = auVar132._4_4_ * auVar137._4_4_;
            auVar62._0_4_ = auVar132._0_4_ * auVar137._0_4_;
            auVar62._8_4_ = auVar132._8_4_ * auVar137._8_4_;
            auVar62._12_4_ = auVar132._12_4_ * auVar137._12_4_;
            auVar62._16_4_ = auVar132._16_4_ * auVar137._16_4_;
            auVar62._20_4_ = auVar132._20_4_ * auVar137._20_4_;
            auVar62._24_4_ = auVar132._24_4_ * auVar137._24_4_;
            auVar62._28_4_ = auVar137._28_4_;
            auVar102 = vfmsub231ps_fma(auVar62,auVar113,auVar133);
            auVar63._4_4_ = auVar108._4_4_ * auVar113._4_4_;
            auVar63._0_4_ = auVar108._0_4_ * auVar113._0_4_;
            auVar63._8_4_ = auVar108._8_4_ * auVar113._8_4_;
            auVar63._12_4_ = auVar108._12_4_ * auVar113._12_4_;
            auVar63._16_4_ = auVar108._16_4_ * auVar113._16_4_;
            auVar63._20_4_ = auVar108._20_4_ * auVar113._20_4_;
            auVar63._24_4_ = auVar108._24_4_ * auVar113._24_4_;
            auVar63._28_4_ = auVar113._28_4_;
            auVar101 = vfmsub231ps_fma(auVar63,auVar132,auVar176);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
            auVar176 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar102));
            auVar176 = vcmpps_avx(auVar176,ZEXT832(0) << 0x20,2);
            auVar15 = vpackssdw_avx(auVar176._0_16_,auVar176._16_16_);
            auVar14 = vpand_avx(auVar15,auVar14);
            auVar176 = vpmovsxwd_avx2(auVar14);
            if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar176 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar176 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar176 >> 0x7f,0) == '\0') &&
                  (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar176 >> 0xbf,0) == '\0') &&
                (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar176[0x1f]) {
LAB_016a2997:
              auVar179 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
              auVar146 = ZEXT3264(local_580);
            }
            else {
              auVar64._4_4_ = auVar210._4_4_ * auVar133._4_4_;
              auVar64._0_4_ = auVar210._0_4_ * auVar133._0_4_;
              auVar64._8_4_ = auVar210._8_4_ * auVar133._8_4_;
              auVar64._12_4_ = auVar210._12_4_ * auVar133._12_4_;
              auVar64._16_4_ = auVar210._16_4_ * auVar133._16_4_;
              auVar64._20_4_ = auVar210._20_4_ * auVar133._20_4_;
              auVar64._24_4_ = auVar210._24_4_ * auVar133._24_4_;
              auVar64._28_4_ = auVar176._28_4_;
              auVar128 = vfmsub231ps_fma(auVar64,auVar132,auVar106);
              auVar198._0_4_ = auVar106._0_4_ * auVar108._0_4_;
              auVar198._4_4_ = auVar106._4_4_ * auVar108._4_4_;
              auVar198._8_4_ = auVar106._8_4_ * auVar108._8_4_;
              auVar198._12_4_ = auVar106._12_4_ * auVar108._12_4_;
              auVar198._16_4_ = auVar106._16_4_ * auVar108._16_4_;
              auVar198._20_4_ = auVar106._20_4_ * auVar108._20_4_;
              auVar198._24_4_ = auVar106._24_4_ * auVar108._24_4_;
              auVar198._28_4_ = 0;
              auVar150 = vfmsub231ps_fma(auVar198,auVar214,auVar133);
              auVar65._4_4_ = auVar214._4_4_ * auVar132._4_4_;
              auVar65._0_4_ = auVar214._0_4_ * auVar132._0_4_;
              auVar65._8_4_ = auVar214._8_4_ * auVar132._8_4_;
              auVar65._12_4_ = auVar214._12_4_ * auVar132._12_4_;
              auVar65._16_4_ = auVar214._16_4_ * auVar132._16_4_;
              auVar65._20_4_ = auVar214._20_4_ * auVar132._20_4_;
              auVar65._24_4_ = auVar214._24_4_ * auVar132._24_4_;
              auVar65._28_4_ = auVar132._28_4_;
              auVar100 = vfmsub231ps_fma(auVar65,auVar108,auVar210);
              auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar150),ZEXT1632(auVar100));
              auVar101 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar128),ZEXT832(0) << 0x20);
              auVar176 = vrcpps_avx(ZEXT1632(auVar101));
              auVar225._8_4_ = 0x3f800000;
              auVar225._0_8_ = &DAT_3f8000003f800000;
              auVar225._12_4_ = 0x3f800000;
              auVar225._16_4_ = 0x3f800000;
              auVar225._20_4_ = 0x3f800000;
              auVar225._24_4_ = 0x3f800000;
              auVar225._28_4_ = 0x3f800000;
              auVar226 = ZEXT3264(auVar225);
              auVar15 = vfnmadd213ps_fma(auVar176,ZEXT1632(auVar101),auVar225);
              auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar176,auVar176);
              auVar177._0_4_ = auVar100._0_4_ * local_7c0._0_4_;
              auVar177._4_4_ = auVar100._4_4_ * local_7c0._4_4_;
              auVar177._8_4_ = auVar100._8_4_ * local_7c0._8_4_;
              auVar177._12_4_ = auVar100._12_4_ * local_7c0._12_4_;
              auVar177._16_4_ = local_7c0._16_4_ * 0.0;
              auVar177._20_4_ = local_7c0._20_4_ * 0.0;
              auVar177._24_4_ = local_7c0._24_4_ * 0.0;
              auVar177._28_4_ = 0;
              auVar150 = vfmadd231ps_fma(auVar177,ZEXT1632(auVar150),auVar115);
              auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar105,ZEXT1632(auVar128));
              fVar149 = auVar15._0_4_;
              fVar148 = auVar15._4_4_;
              fVar119 = auVar15._8_4_;
              fVar121 = auVar15._12_4_;
              auVar176 = ZEXT1632(CONCAT412(fVar121 * auVar150._12_4_,
                                            CONCAT48(fVar119 * auVar150._8_4_,
                                                     CONCAT44(fVar148 * auVar150._4_4_,
                                                              fVar149 * auVar150._0_4_))));
              uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar178._4_4_ = uVar126;
              auVar178._0_4_ = uVar126;
              auVar178._8_4_ = uVar126;
              auVar178._12_4_ = uVar126;
              auVar178._16_4_ = uVar126;
              auVar178._20_4_ = uVar126;
              auVar178._24_4_ = uVar126;
              auVar178._28_4_ = uVar126;
              auVar105 = vcmpps_avx(local_360,auVar176,2);
              auVar115 = vcmpps_avx(auVar176,auVar178,2);
              auVar105 = vandps_avx(auVar115,auVar105);
              auVar15 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
              auVar14 = vpand_avx(auVar14,auVar15);
              auVar105 = vpmovsxwd_avx2(auVar14);
              if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar105 >> 0x7f,0) == '\0') &&
                    (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar105 >> 0xbf,0) == '\0') &&
                  (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar105[0x1f]) goto LAB_016a2997;
              auVar105 = vcmpps_avx(ZEXT1632(auVar101),ZEXT832(0) << 0x20,4);
              auVar15 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
              auVar14 = vpand_avx(auVar14,auVar15);
              auVar105 = vpmovsxwd_avx2(auVar14);
              auVar179 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
              auVar146 = ZEXT3264(local_580);
              if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar105 >> 0x7f,0) != '\0') ||
                    (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar105 >> 0xbf,0) != '\0') ||
                  (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar105[0x1f] < '\0') {
                auVar113 = ZEXT1632(CONCAT412(fVar121 * auVar16._12_4_,
                                              CONCAT48(fVar119 * auVar16._8_4_,
                                                       CONCAT44(fVar148 * auVar16._4_4_,
                                                                fVar149 * auVar16._0_4_))));
                auVar66._28_4_ = SUB84(uStack_5a8,4);
                auVar66._0_28_ =
                     ZEXT1628(CONCAT412(fVar121 * auVar102._12_4_,
                                        CONCAT48(fVar119 * auVar102._8_4_,
                                                 CONCAT44(fVar148 * auVar102._4_4_,
                                                          fVar149 * auVar102._0_4_))));
                auVar207._8_4_ = 0x3f800000;
                auVar207._0_8_ = &DAT_3f8000003f800000;
                auVar207._12_4_ = 0x3f800000;
                auVar207._16_4_ = 0x3f800000;
                auVar207._20_4_ = 0x3f800000;
                auVar207._24_4_ = 0x3f800000;
                auVar207._28_4_ = 0x3f800000;
                auVar115 = vsubps_avx(auVar207,auVar113);
                local_c0 = vblendvps_avx(auVar115,auVar113,auVar18);
                auVar115 = vsubps_avx(auVar207,auVar66);
                local_3c0 = vblendvps_avx(auVar115,auVar66,auVar18);
                auVar179 = ZEXT3264(auVar105);
                auVar146 = ZEXT3264(auVar176);
              }
            }
            auVar105 = auVar179._0_32_;
            local_580 = auVar146._0_32_;
            if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar105 >> 0x7f,0) == '\0') &&
                  (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar105 >> 0xbf,0) == '\0') &&
                (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar179[0x1f]) goto LAB_016a268d;
            auVar115 = vsubps_avx(auVar140,auVar166);
            auVar14 = vfmadd213ps_fma(auVar115,local_c0,auVar166);
            fVar149 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar67._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar149;
            auVar67._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar149;
            auVar67._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar149;
            auVar67._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar149;
            auVar67._16_4_ = fVar149 * 0.0;
            auVar67._20_4_ = fVar149 * 0.0;
            auVar67._24_4_ = fVar149 * 0.0;
            auVar67._28_4_ = fVar149;
            auVar115 = vcmpps_avx(local_580,auVar67,6);
            auVar176 = auVar105 & auVar115;
            auVar202 = ZEXT3264(CONCAT428(fStack_784,
                                          CONCAT424(fStack_788,
                                                    CONCAT420(fStack_78c,
                                                              CONCAT416(fStack_790,
                                                                        CONCAT412(fStack_794,
                                                                                  CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
            if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar176 >> 0x7f,0) != '\0') ||
                  (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar176 >> 0xbf,0) != '\0') ||
                (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar176[0x1f] < '\0') {
              local_440 = vandps_avx(auVar115,auVar105);
              auVar141._8_4_ = 0xbf800000;
              auVar141._0_8_ = 0xbf800000bf800000;
              auVar141._12_4_ = 0xbf800000;
              auVar141._16_4_ = 0xbf800000;
              auVar141._20_4_ = 0xbf800000;
              auVar141._24_4_ = 0xbf800000;
              auVar141._28_4_ = 0xbf800000;
              auVar167._8_4_ = 0x40000000;
              auVar167._0_8_ = 0x4000000040000000;
              auVar167._12_4_ = 0x40000000;
              auVar167._16_4_ = 0x40000000;
              auVar167._20_4_ = 0x40000000;
              auVar167._24_4_ = 0x40000000;
              auVar167._28_4_ = 0x40000000;
              auVar14 = vfmadd213ps_fma(local_3c0,auVar167,auVar141);
              auVar179 = ZEXT1664(auVar14);
              local_500 = local_c0;
              local_4e0 = ZEXT1632(auVar14);
              local_3c0 = local_4e0;
              auVar105 = local_3c0;
              local_490 = local_800;
              uStack_488 = uStack_7f8;
              local_480 = local_740._0_8_;
              uStack_478 = local_740._8_8_;
              local_470 = local_750._0_8_;
              uStack_468 = local_750._8_8_;
              local_460 = local_6f0;
              uStack_458 = uStack_6e8;
              pGVar9 = (context->scene->geometries).items[uVar7].ptr;
              local_3c0 = auVar105;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar149 = (float)local_4a0;
                local_420[0] = (fVar149 + local_c0._0_4_ + 0.0) * local_520;
                local_420[1] = (fVar149 + local_c0._4_4_ + 1.0) * (float)auStack_51c._0_4_;
                local_420[2] = (fVar149 + local_c0._8_4_ + 2.0) * (float)auStack_51c._4_4_;
                local_420[3] = (fVar149 + local_c0._12_4_ + 3.0) * fStack_514;
                fStack_410 = (fVar149 + local_c0._16_4_ + 4.0) * fStack_510;
                fStack_40c = (fVar149 + local_c0._20_4_ + 5.0) * fStack_50c;
                fStack_408 = (fVar149 + local_c0._24_4_ + 6.0) * fStack_508;
                fStack_404 = fVar149 + local_c0._28_4_ + 7.0;
                local_3c0._0_8_ = auVar14._0_8_;
                local_3c0._8_8_ = auVar14._8_8_;
                local_400 = local_3c0._0_8_;
                uStack_3f8 = local_3c0._8_8_;
                uStack_3f0 = 0;
                uStack_3e8 = 0;
                local_3e0 = local_580;
                auVar142._8_4_ = 0x7f800000;
                auVar142._0_8_ = 0x7f8000007f800000;
                auVar142._12_4_ = 0x7f800000;
                auVar142._16_4_ = 0x7f800000;
                auVar142._20_4_ = 0x7f800000;
                auVar142._24_4_ = 0x7f800000;
                auVar142._28_4_ = 0x7f800000;
                auVar105 = vblendvps_avx(auVar142,local_580,local_440);
                auVar115 = vshufps_avx(auVar105,auVar105,0xb1);
                auVar115 = vminps_avx(auVar105,auVar115);
                auVar176 = vshufpd_avx(auVar115,auVar115,5);
                auVar115 = vminps_avx(auVar115,auVar176);
                auVar176 = vpermpd_avx2(auVar115,0x4e);
                auVar115 = vminps_avx(auVar115,auVar176);
                auVar115 = vcmpps_avx(auVar105,auVar115,0);
                auVar176 = local_440 & auVar115;
                auVar105 = local_440;
                if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar176 >> 0x7f,0) != '\0') ||
                      (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar176 >> 0xbf,0) != '\0') ||
                    (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar176[0x1f] < '\0') {
                  auVar105 = vandps_avx(auVar115,local_440);
                }
                uVar92 = vmovmskps_avx(auVar105);
                uVar95 = 0;
                for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                  uVar95 = uVar95 + 1;
                }
                uVar93 = (ulong)uVar95;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar149 = local_420[uVar93];
                  uVar126 = *(undefined4 *)((long)&local_400 + uVar93 * 4);
                  fVar119 = 1.0 - fVar149;
                  fVar148 = fVar119 * fVar119 * -3.0;
                  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * fVar119)),
                                            ZEXT416((uint)(fVar149 * fVar119)),ZEXT416(0xc0000000));
                  auVar14 = vfmsub132ss_fma(ZEXT416((uint)(fVar149 * fVar119)),
                                            ZEXT416((uint)(fVar149 * fVar149)),ZEXT416(0x40000000));
                  fVar119 = auVar13._0_4_ * 3.0;
                  fVar121 = auVar14._0_4_ * 3.0;
                  fVar122 = fVar149 * fVar149 * 3.0;
                  auVar189._0_4_ = fVar122 * (float)local_6f0._0_4_;
                  auVar189._4_4_ = fVar122 * (float)local_6f0._4_4_;
                  auVar189._8_4_ = fVar122 * (float)uStack_6e8;
                  auVar189._12_4_ = fVar122 * uStack_6e8._4_4_;
                  auVar155._4_4_ = fVar121;
                  auVar155._0_4_ = fVar121;
                  auVar155._8_4_ = fVar121;
                  auVar155._12_4_ = fVar121;
                  auVar13 = vfmadd132ps_fma(auVar155,auVar189,local_750);
                  auVar173._4_4_ = fVar119;
                  auVar173._0_4_ = fVar119;
                  auVar173._8_4_ = fVar119;
                  auVar173._12_4_ = fVar119;
                  auVar13 = vfmadd132ps_fma(auVar173,auVar13,local_740);
                  auVar156._4_4_ = fVar148;
                  auVar156._0_4_ = fVar148;
                  auVar156._8_4_ = fVar148;
                  auVar156._12_4_ = fVar148;
                  auVar13 = vfmadd132ps_fma(auVar156,auVar13,auVar12);
                  auVar179 = ZEXT464(*(uint *)(local_3e0 + uVar93 * 4));
                  *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3e0 + uVar93 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar13._0_4_;
                  uVar203 = vextractps_avx(auVar13,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar203;
                  uVar203 = vextractps_avx(auVar13,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar203;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar149;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar126;
                  *(uint *)(ray + k * 4 + 0x220) = uVar8;
                  *(uint *)(ray + k * 4 + 0x240) = uVar7;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_940 = ZEXT1632(CONCAT88(auVar13._8_8_,uVar93));
                  local_7c0._0_16_ = local_750;
                  _local_720 = ZEXT1632(_local_6f0);
                  local_620 = local_440;
                  local_4c0 = local_580;
                  local_49c = iVar91;
                  _local_2e0 = auVar11;
                  do {
                    auVar115 = local_940;
                    uVar95 = *(uint *)(ray + k * 4 + 0x100);
                    local_1a0 = local_420[local_940._0_8_];
                    uVar126 = *(undefined4 *)((long)&local_400 + local_940._0_8_ * 4);
                    local_180._4_4_ = uVar126;
                    local_180._0_4_ = uVar126;
                    local_180._8_4_ = uVar126;
                    local_180._12_4_ = uVar126;
                    local_180._16_4_ = uVar126;
                    local_180._20_4_ = uVar126;
                    local_180._24_4_ = uVar126;
                    local_180._28_4_ = uVar126;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_3e0 + local_940._0_8_ * 4);
                    fVar119 = 1.0 - local_1a0;
                    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * fVar119)),
                                              ZEXT416((uint)(local_1a0 * fVar119)),
                                              ZEXT416(0xc0000000));
                    auVar13 = vfmsub132ss_fma(ZEXT416((uint)(local_1a0 * fVar119)),
                                              ZEXT416((uint)(local_1a0 * local_1a0)),
                                              ZEXT416(0x40000000));
                    fVar149 = auVar13._0_4_ * 3.0;
                    fVar148 = local_1a0 * local_1a0 * 3.0;
                    auVar190._0_4_ = fVar148 * (float)local_720._0_4_;
                    auVar190._4_4_ = fVar148 * (float)local_720._4_4_;
                    auVar190._8_4_ = fVar148 * (float)uStack_718;
                    auVar190._12_4_ = fVar148 * uStack_718._4_4_;
                    auVar157._4_4_ = fVar149;
                    auVar157._0_4_ = fVar149;
                    auVar157._8_4_ = fVar149;
                    auVar157._12_4_ = fVar149;
                    auVar13 = vfmadd132ps_fma(auVar157,auVar190,local_7c0._0_16_);
                    fVar149 = auVar14._0_4_ * 3.0;
                    auVar182._4_4_ = fVar149;
                    auVar182._0_4_ = fVar149;
                    auVar182._8_4_ = fVar149;
                    auVar182._12_4_ = fVar149;
                    auVar13 = vfmadd132ps_fma(auVar182,auVar13,auVar17);
                    fVar149 = fVar119 * fVar119 * -3.0;
                    local_7f0.context = context->user;
                    auVar158._4_4_ = fVar149;
                    auVar158._0_4_ = fVar149;
                    auVar158._8_4_ = fVar149;
                    auVar158._12_4_ = fVar149;
                    auVar14 = vfmadd132ps_fma(auVar158,auVar13,auVar12);
                    local_200 = auVar14._0_4_;
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    auVar13 = vmovshdup_avx(auVar14);
                    auVar174._0_8_ = auVar13._0_8_;
                    auVar174._8_8_ = auVar174._0_8_;
                    local_1e0._16_8_ = auVar174._0_8_;
                    local_1e0._0_16_ = auVar174;
                    local_1e0._24_8_ = auVar174._0_8_;
                    auVar179 = ZEXT3264(local_1e0);
                    auVar13 = vshufps_avx(auVar14,auVar14,0xaa);
                    auVar159._0_8_ = auVar13._0_8_;
                    auVar159._8_8_ = auVar159._0_8_;
                    auVar168._16_8_ = auVar159._0_8_;
                    auVar168._0_16_ = auVar159;
                    auVar168._24_8_ = auVar159._0_8_;
                    local_1c0 = auVar168;
                    fStack_19c = local_1a0;
                    fStack_198 = local_1a0;
                    fStack_194 = local_1a0;
                    fStack_190 = local_1a0;
                    fStack_18c = local_1a0;
                    fStack_188 = local_1a0;
                    fStack_184 = local_1a0;
                    local_160 = CONCAT44(uStack_dc,local_e0);
                    uStack_158 = CONCAT44(uStack_d4,uStack_d8);
                    uStack_150 = CONCAT44(uStack_cc,uStack_d0);
                    uStack_148 = CONCAT44(uStack_c4,uStack_c8);
                    local_140 = local_380._0_8_;
                    uStack_138 = local_380._8_8_;
                    uStack_130 = local_380._16_8_;
                    uStack_128 = local_380._24_8_;
                    auVar105 = vpcmpeqd_avx2(local_180,local_180);
                    local_728[1] = auVar105;
                    *local_728 = auVar105;
                    local_120 = (local_7f0.context)->instID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_100 = (local_7f0.context)->instPrimID[0];
                    uStack_fc = local_100;
                    uStack_f8 = local_100;
                    uStack_f4 = local_100;
                    uStack_f0 = local_100;
                    uStack_ec = local_100;
                    uStack_e8 = local_100;
                    uStack_e4 = local_100;
                    local_600 = local_280._0_8_;
                    uStack_5f8 = local_280._8_8_;
                    uStack_5f0 = local_280._16_8_;
                    uStack_5e8 = local_280._24_8_;
                    local_7f0.valid = (int *)&local_600;
                    local_7f0.geometryUserPtr = pGVar9->userPtr;
                    local_7f0.hit = (RTCHitN *)&local_200;
                    local_7f0.N = 8;
                    local_7f0.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar168 = ZEXT1632(auVar159);
                      auVar179 = ZEXT1664(auVar174);
                      (*pGVar9->intersectionFilterN)(&local_7f0);
                      auVar147._8_56_ = extraout_var;
                      auVar147._0_8_ = extraout_XMM1_Qa;
                      auVar202 = ZEXT3264(CONCAT428(fStack_784,
                                                    CONCAT424(fStack_788,
                                                              CONCAT420(fStack_78c,
                                                                        CONCAT416(fStack_790,
                                                                                  CONCAT412(
                                                  fStack_794,
                                                  CONCAT48(fStack_798,CONCAT44(fStack_79c,local_7a0)
                                                          )))))));
                      auVar146 = ZEXT3264(local_580);
                      auVar105 = vpcmpeqd_avx2(auVar147._0_32_,auVar147._0_32_);
                    }
                    auVar137 = auVar179._0_32_;
                    auVar83._8_8_ = uStack_5f8;
                    auVar83._0_8_ = local_600;
                    auVar83._16_8_ = uStack_5f0;
                    auVar83._24_8_ = uStack_5e8;
                    auVar113 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar83);
                    auVar176 = auVar105 & ~auVar113;
                    if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar176 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar176 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar176 >> 0x7f,0) == '\0') &&
                          (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar176 >> 0xbf,0) == '\0') &&
                        (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar176[0x1f]) {
                      auVar113 = auVar113 ^ auVar105;
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar168 = ZEXT1632(auVar168._0_16_);
                        auVar137 = ZEXT1632(auVar179._0_16_);
                        (*p_Var10)(&local_7f0);
                        auVar202 = ZEXT3264(CONCAT428(fStack_784,
                                                      CONCAT424(fStack_788,
                                                                CONCAT420(fStack_78c,
                                                                          CONCAT416(fStack_790,
                                                                                    CONCAT412(
                                                  fStack_794,
                                                  CONCAT48(fStack_798,CONCAT44(fStack_79c,local_7a0)
                                                          )))))));
                        auVar146 = ZEXT3264(local_580);
                      }
                      auVar84._8_8_ = uStack_5f8;
                      auVar84._0_8_ = local_600;
                      auVar84._16_8_ = uStack_5f0;
                      auVar84._24_8_ = uStack_5e8;
                      auVar176 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar84);
                      auVar105 = vpcmpeqd_avx2(auVar137,auVar137);
                      auVar179 = ZEXT3264(auVar105);
                      auVar113 = auVar176 ^ auVar105;
                      auVar137 = vpcmpeqd_avx2(auVar168,auVar168);
                      auVar105 = auVar105 & ~auVar176;
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar105 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar105 >> 0x7f,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0xbf,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar105[0x1f] < '\0') {
                        auVar176 = auVar176 ^ auVar137;
                        auVar105 = vmaskmovps_avx(auVar176,*(undefined1 (*) [32])local_7f0.hit);
                        *(undefined1 (*) [32])(local_7f0.ray + 0x180) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar176,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x20));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x1a0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar176,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x40));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x1c0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar176,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x60));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x1e0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar176,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x80));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x200) = auVar105;
                        auVar105 = vpmaskmovd_avx2(auVar176,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x220) = auVar105;
                        auVar105 = vpmaskmovd_avx2(auVar176,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x240) = auVar105;
                        auVar105 = vpmaskmovd_avx2(auVar176,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x260) = auVar105;
                        auVar105 = vpmaskmovd_avx2(auVar176,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0x100));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x280) = auVar105;
                      }
                    }
                    auVar226 = ZEXT464(uVar95);
                    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar113 >> 0x7f,0) == '\0') &&
                          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar113 >> 0xbf,0) == '\0') &&
                        (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar113[0x1f]) {
                      *(uint *)(ray + k * 4 + 0x100) = uVar95;
                    }
                    *(undefined4 *)(local_620 + local_940._0_8_ * 4) = 0;
                    uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
                    auVar114._4_4_ = uVar126;
                    auVar114._0_4_ = uVar126;
                    auVar114._8_4_ = uVar126;
                    auVar114._12_4_ = uVar126;
                    auVar114._16_4_ = uVar126;
                    auVar114._20_4_ = uVar126;
                    auVar114._24_4_ = uVar126;
                    auVar114._28_4_ = uVar126;
                    auVar176 = vcmpps_avx(auVar146._0_32_,auVar114,2);
                    auVar105 = vandps_avx(auVar176,local_620);
                    local_620 = local_620 & auVar176;
                    bVar75 = (local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar76 = (local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar74 = (local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar73 = SUB321(local_620 >> 0x7f,0) != '\0';
                    bVar72 = (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar71 = SUB321(local_620 >> 0xbf,0) != '\0';
                    bVar69 = (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar68 = local_620[0x1f] < '\0';
                    if (((((((bVar75 || bVar76) || bVar74) || bVar73) || bVar72) || bVar71) ||
                        bVar69) || bVar68) {
                      auVar143._8_4_ = 0x7f800000;
                      auVar143._0_8_ = 0x7f8000007f800000;
                      auVar143._12_4_ = 0x7f800000;
                      auVar143._16_4_ = 0x7f800000;
                      auVar143._20_4_ = 0x7f800000;
                      auVar143._24_4_ = 0x7f800000;
                      auVar143._28_4_ = 0x7f800000;
                      auVar176 = vblendvps_avx(auVar143,auVar146._0_32_,auVar105);
                      auVar113 = vshufps_avx(auVar176,auVar176,0xb1);
                      auVar113 = vminps_avx(auVar176,auVar113);
                      auVar137 = vshufpd_avx(auVar113,auVar113,5);
                      auVar113 = vminps_avx(auVar113,auVar137);
                      auVar137 = vpermpd_avx2(auVar113,0x4e);
                      auVar179 = ZEXT3264(auVar137);
                      auVar113 = vminps_avx(auVar113,auVar137);
                      auVar113 = vcmpps_avx(auVar176,auVar113,0);
                      auVar137 = auVar105 & auVar113;
                      auVar176 = auVar105;
                      if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar137 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar137 >> 0x7f,0) != '\0') ||
                            (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar137 >> 0xbf,0) != '\0') ||
                          (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar137[0x1f] < '\0') {
                        auVar176 = vandps_avx(auVar113,auVar105);
                      }
                      uVar95 = vmovmskps_avx(auVar176);
                      local_940._0_4_ = 0;
                      for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
                        local_940._0_4_ = local_940._0_4_ + 1;
                      }
                      local_940._4_4_ = 0;
                      local_940._8_24_ = auVar115._8_24_;
                    }
                    local_620 = auVar105;
                  } while (((((((bVar75 || bVar76) || bVar74) || bVar73) || bVar72) || bVar71) ||
                           bVar69) || bVar68);
                }
              }
            }
          }
          auVar146 = ZEXT3264(local_780);
          lVar94 = lVar94 + 8;
        } while ((int)lVar94 < iVar91);
      }
      uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar104._4_4_ = uVar126;
      auVar104._0_4_ = uVar126;
      auVar104._8_4_ = uVar126;
      auVar104._12_4_ = uVar126;
      auVar12 = vcmpps_avx(local_2a0,auVar104,2);
      uVar95 = vmovmskps_avx(auVar12);
      uVar90 = uVar90 & uVar90 + 0xf & uVar95;
    } while (uVar90 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }